

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [60];
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  byte bVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar103 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar104 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar118 [64];
  int iVar119;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  undefined4 uVar124;
  float fVar135;
  float fVar136;
  vint4 bi_1;
  float fVar137;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 ai_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  vint4 ai;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar188;
  float fVar189;
  vfloat4 a0_3;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  __m128 a_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar221;
  float fVar222;
  __m128 a;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar233;
  float fVar242;
  float fVar243;
  vfloat4 a0_1;
  float fVar244;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar245;
  float fVar253;
  float fVar254;
  vfloat4 a0;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar255;
  undefined1 auVar252 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  int iVar266;
  undefined1 in_ZMM30 [64];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_640;
  undefined1 local_610 [16];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  uint auStack_5d0 [4];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar48;
  undefined1 auVar109 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  
  PVar3 = prim[1];
  uVar51 = (ulong)(byte)PVar3;
  fVar120 = *(float *)(prim + uVar51 * 0x19 + 0x12);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar55 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar56 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar55 = vsubps_avx(auVar55,*(undefined1 (*) [16])(prim + uVar51 * 0x19 + 6));
  auVar76._0_4_ = fVar120 * auVar55._0_4_;
  auVar76._4_4_ = fVar120 * auVar55._4_4_;
  auVar76._8_4_ = fVar120 * auVar55._8_4_;
  auVar76._12_4_ = fVar120 * auVar55._12_4_;
  auVar66._0_4_ = fVar120 * auVar56._0_4_;
  auVar66._4_4_ = fVar120 * auVar56._4_4_;
  auVar66._8_4_ = fVar120 * auVar56._8_4_;
  auVar66._12_4_ = fVar120 * auVar56._12_4_;
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 4 + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 5 + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 6 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 * 0xb + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar51 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar54 = (ulong)(uint)((int)(uVar51 * 9) * 2);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + uVar51 + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  uVar47 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar246._4_4_ = auVar66._0_4_;
  auVar246._0_4_ = auVar66._0_4_;
  auVar246._8_4_ = auVar66._0_4_;
  auVar246._12_4_ = auVar66._0_4_;
  auVar62 = vshufps_avx(auVar66,auVar66,0x55);
  auVar58 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar120 = auVar58._0_4_;
  auVar77._0_4_ = fVar120 * auVar57._0_4_;
  fVar226 = auVar58._4_4_;
  auVar77._4_4_ = fVar226 * auVar57._4_4_;
  fVar209 = auVar58._8_4_;
  auVar77._8_4_ = fVar209 * auVar57._8_4_;
  fVar221 = auVar58._12_4_;
  auVar77._12_4_ = fVar221 * auVar57._12_4_;
  auVar80._0_4_ = auVar63._0_4_ * fVar120;
  auVar80._4_4_ = auVar63._4_4_ * fVar226;
  auVar80._8_4_ = auVar63._8_4_ * fVar209;
  auVar80._12_4_ = auVar63._12_4_ * fVar221;
  auVar68._0_4_ = auVar61._0_4_ * fVar120;
  auVar68._4_4_ = auVar61._4_4_ * fVar226;
  auVar68._8_4_ = auVar61._8_4_ * fVar209;
  auVar68._12_4_ = auVar61._12_4_ * fVar221;
  auVar58 = vfmadd231ps_fma(auVar77,auVar62,auVar56);
  auVar64 = vfmadd231ps_fma(auVar80,auVar62,auVar67);
  auVar62 = vfmadd231ps_fma(auVar68,auVar59,auVar62);
  auVar65 = vfmadd231ps_fma(auVar58,auVar246,auVar55);
  auVar64 = vfmadd231ps_fma(auVar64,auVar246,auVar26);
  auVar66 = vfmadd231ps_fma(auVar62,auVar60,auVar246);
  auVar79._4_4_ = auVar76._0_4_;
  auVar79._0_4_ = auVar76._0_4_;
  auVar79._8_4_ = auVar76._0_4_;
  auVar79._12_4_ = auVar76._0_4_;
  auVar62 = vshufps_avx(auVar76,auVar76,0x55);
  auVar58 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar120 = auVar58._0_4_;
  auVar261._0_4_ = fVar120 * auVar57._0_4_;
  fVar226 = auVar58._4_4_;
  auVar261._4_4_ = fVar226 * auVar57._4_4_;
  fVar209 = auVar58._8_4_;
  auVar261._8_4_ = fVar209 * auVar57._8_4_;
  fVar221 = auVar58._12_4_;
  auVar261._12_4_ = fVar221 * auVar57._12_4_;
  auVar72._0_4_ = auVar63._0_4_ * fVar120;
  auVar72._4_4_ = auVar63._4_4_ * fVar226;
  auVar72._8_4_ = auVar63._8_4_ * fVar209;
  auVar72._12_4_ = auVar63._12_4_ * fVar221;
  auVar71._0_4_ = auVar61._0_4_ * fVar120;
  auVar71._4_4_ = auVar61._4_4_ * fVar226;
  auVar71._8_4_ = auVar61._8_4_ * fVar209;
  auVar71._12_4_ = auVar61._12_4_ * fVar221;
  auVar56 = vfmadd231ps_fma(auVar261,auVar62,auVar56);
  auVar57 = vfmadd231ps_fma(auVar72,auVar62,auVar67);
  auVar67 = vfmadd231ps_fma(auVar71,auVar62,auVar59);
  auVar63 = vfmadd231ps_fma(auVar56,auVar79,auVar55);
  auVar59 = vfmadd231ps_fma(auVar57,auVar79,auVar26);
  auVar104._16_48_ = in_ZmmResult._16_48_;
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar55);
  auVar61 = vfmadd231ps_fma(auVar67,auVar79,auVar60);
  auVar56 = vandps_avx512vl(auVar65,auVar55);
  auVar74._8_4_ = 0x219392ef;
  auVar74._0_8_ = 0x219392ef219392ef;
  auVar74._12_4_ = 0x219392ef;
  uVar54 = vcmpps_avx512vl(auVar56,auVar74,1);
  bVar10 = (bool)((byte)uVar54 & 1);
  auVar58._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._0_4_;
  bVar10 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._4_4_;
  bVar10 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._8_4_;
  bVar10 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._12_4_;
  auVar56 = vandps_avx512vl(auVar64,auVar55);
  uVar54 = vcmpps_avx512vl(auVar56,auVar74,1);
  bVar10 = (bool)((byte)uVar54 & 1);
  auVar65._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._0_4_;
  bVar10 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._4_4_;
  bVar10 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._8_4_;
  bVar10 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._12_4_;
  auVar55 = vandps_avx512vl(auVar66,auVar55);
  uVar54 = vcmpps_avx512vl(auVar55,auVar74,1);
  bVar10 = (bool)((byte)uVar54 & 1);
  auVar64._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar66._0_4_;
  bVar10 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar66._4_4_;
  bVar10 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar66._8_4_;
  bVar10 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar66._12_4_;
  auVar55 = vrcp14ps_avx512vl(auVar58);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT1664(auVar56);
  auVar57 = vfnmadd213ps_avx512vl(auVar58,auVar55,auVar56);
  auVar26 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar65);
  auVar57 = vfnmadd213ps_avx512vl(auVar65,auVar55,auVar56);
  auVar67 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar64);
  auVar56 = vfnmadd213ps_avx512vl(auVar64,auVar55,auVar56);
  auVar60 = vfmadd132ps_fma(auVar56,auVar55,auVar55);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar51 * 7 + 6);
  auVar55 = vpmovsxwd_avx(auVar55);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar63);
  auVar81._0_4_ = auVar26._0_4_ * auVar55._0_4_;
  auVar81._4_4_ = auVar26._4_4_ * auVar55._4_4_;
  auVar81._8_4_ = auVar26._8_4_ * auVar55._8_4_;
  auVar81._12_4_ = auVar26._12_4_ * auVar55._12_4_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar51 * 9 + 6);
  auVar55 = vpmovsxwd_avx(auVar56);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar63);
  auVar58 = vpbroadcastd_avx512vl();
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar56 = vpmovsxwd_avx(auVar57);
  auVar78._0_4_ = auVar26._0_4_ * auVar55._0_4_;
  auVar78._4_4_ = auVar26._4_4_ * auVar55._4_4_;
  auVar78._8_4_ = auVar26._8_4_ * auVar55._8_4_;
  auVar78._12_4_ = auVar26._12_4_ * auVar55._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar51 * -2 + 6);
  auVar55 = vpmovsxwd_avx(auVar26);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar59);
  auVar75._0_4_ = auVar67._0_4_ * auVar55._0_4_;
  auVar75._4_4_ = auVar67._4_4_ * auVar55._4_4_;
  auVar75._8_4_ = auVar67._8_4_ * auVar55._8_4_;
  auVar75._12_4_ = auVar67._12_4_ * auVar55._12_4_;
  auVar55 = vcvtdq2ps_avx(auVar56);
  auVar55 = vsubps_avx(auVar55,auVar59);
  auVar70._0_4_ = auVar67._0_4_ * auVar55._0_4_;
  auVar70._4_4_ = auVar67._4_4_ * auVar55._4_4_;
  auVar70._8_4_ = auVar67._8_4_ * auVar55._8_4_;
  auVar70._12_4_ = auVar67._12_4_ * auVar55._12_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar47 + uVar51 + 6);
  auVar55 = vpmovsxwd_avx(auVar67);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar61);
  auVar73._0_4_ = auVar60._0_4_ * auVar55._0_4_;
  auVar73._4_4_ = auVar60._4_4_ * auVar55._4_4_;
  auVar73._8_4_ = auVar60._8_4_ * auVar55._8_4_;
  auVar73._12_4_ = auVar60._12_4_ * auVar55._12_4_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar51 * 0x17 + 6);
  auVar55 = vpmovsxwd_avx(auVar63);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar61);
  auVar69._0_4_ = auVar60._0_4_ * auVar55._0_4_;
  auVar69._4_4_ = auVar60._4_4_ * auVar55._4_4_;
  auVar69._8_4_ = auVar60._8_4_ * auVar55._8_4_;
  auVar69._12_4_ = auVar60._12_4_ * auVar55._12_4_;
  auVar55 = vpminsd_avx(auVar81,auVar78);
  auVar56 = vpminsd_avx(auVar75,auVar70);
  auVar55 = vmaxps_avx(auVar55,auVar56);
  auVar56 = vpminsd_avx(auVar73,auVar69);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar60._4_4_ = uVar124;
  auVar60._0_4_ = uVar124;
  auVar60._8_4_ = uVar124;
  auVar60._12_4_ = uVar124;
  auVar56 = vmaxps_avx512vl(auVar56,auVar60);
  auVar55 = vmaxps_avx(auVar55,auVar56);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar55,auVar59);
  auVar55 = vpmaxsd_avx(auVar81,auVar78);
  auVar56 = vpmaxsd_avx(auVar75,auVar70);
  auVar55 = vminps_avx(auVar55,auVar56);
  auVar56 = vpmaxsd_avx(auVar73,auVar69);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar61._4_4_ = uVar124;
  auVar61._0_4_ = uVar124;
  auVar61._8_4_ = uVar124;
  auVar61._12_4_ = uVar124;
  auVar56 = vminps_avx512vl(auVar56,auVar61);
  auVar55 = vminps_avx(auVar55,auVar56);
  auVar62._8_4_ = 0x3f800003;
  auVar62._0_8_ = 0x3f8000033f800003;
  auVar62._12_4_ = 0x3f800003;
  auVar55 = vmulps_avx512vl(auVar55,auVar62);
  uVar27 = vcmpps_avx512vl(local_5c0,auVar55,2);
  uVar54 = vpcmpgtd_avx512vl(auVar58,_DAT_01ff0cf0);
  uVar54 = ((byte)uVar27 & 0xf) & uVar54;
  if ((char)uVar54 == '\0') {
    return;
  }
  auVar123 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar123);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar123 = ZEXT1664(auVar55);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar262 = ZEXT1664(auVar55);
  auVar55 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar267 = ZEXT1664(auVar55);
LAB_01b43135:
  lVar52 = 0;
  for (uVar47 = uVar54; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar53 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar52 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar53].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar47 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar4 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar55 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar47);
  lVar52 = uVar47 + 1;
  auVar56 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar52);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar57 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar47);
  auVar26 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar52);
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar120 = *(float *)(ray + k * 4 + 0xc0);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar60 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar47),
                       auVar55,auVar59);
  auVar61 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar52),
                       auVar56,auVar59);
  auVar62 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar47 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar57,auVar59);
  auVar58 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar52),
                       auVar26,auVar59);
  auVar252._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar63 = vmulps_avx512vl(auVar56,auVar252._0_16_);
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar61,auVar252._0_16_);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar60,auVar64);
  auVar138._0_4_ = auVar55._0_4_ + auVar63._0_4_;
  auVar138._4_4_ = auVar55._4_4_ + auVar63._4_4_;
  auVar138._8_4_ = auVar55._8_4_ + auVar63._8_4_;
  auVar138._12_4_ = auVar55._12_4_ + auVar63._12_4_;
  auVar68 = auVar123._0_16_;
  auVar63 = vfmadd231ps_avx512vl(auVar64,auVar60,auVar68);
  auVar64 = vfnmadd231ps_avx512vl(auVar63,auVar55,auVar68);
  auVar63 = vmulps_avx512vl(auVar26,auVar252._0_16_);
  auVar65 = vfmadd231ps_avx512vl(auVar63,auVar58,auVar252._0_16_);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar62,auVar65);
  auVar247._0_4_ = auVar57._0_4_ + auVar63._0_4_;
  auVar247._4_4_ = auVar57._4_4_ + auVar63._4_4_;
  auVar247._8_4_ = auVar57._8_4_ + auVar63._8_4_;
  auVar247._12_4_ = auVar57._12_4_ + auVar63._12_4_;
  auVar63 = vfmadd231ps_avx512vl(auVar65,auVar62,auVar68);
  auVar65 = vfnmadd231ps_avx512vl(auVar63,auVar57,auVar68);
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar56);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar60,auVar252._0_16_);
  auVar66 = vfmadd231ps_avx512vl(auVar63,auVar55,auVar252._0_16_);
  auVar56 = vmulps_avx512vl(auVar56,auVar68);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar68,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar252._0_16_,auVar60);
  auVar61 = vfnmadd231ps_avx512vl(auVar56,auVar252._0_16_,auVar55);
  auVar55 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar26);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar62,auVar252._0_16_);
  auVar63 = vfmadd231ps_avx512vl(auVar55,auVar57,auVar252._0_16_);
  auVar55 = vmulps_avx512vl(auVar26,auVar68);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar68,auVar58);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar252._0_16_,auVar62);
  auVar60 = vfnmadd231ps_avx512vl(auVar55,auVar252._0_16_,auVar57);
  auVar55 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar56 = vshufps_avx(auVar247,auVar247,0xc9);
  fVar225 = auVar64._0_4_;
  auVar177._0_4_ = fVar225 * auVar56._0_4_;
  fVar135 = auVar64._4_4_;
  auVar177._4_4_ = fVar135 * auVar56._4_4_;
  fVar136 = auVar64._8_4_;
  auVar177._8_4_ = fVar136 * auVar56._8_4_;
  fVar137 = auVar64._12_4_;
  auVar177._12_4_ = fVar137 * auVar56._12_4_;
  auVar56 = vfmsub231ps_fma(auVar177,auVar55,auVar247);
  auVar57 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar204._0_4_ = auVar56._0_4_ * fVar225;
  auVar204._4_4_ = auVar56._4_4_ * fVar135;
  auVar204._8_4_ = auVar56._8_4_ * fVar136;
  auVar204._12_4_ = auVar56._12_4_ * fVar137;
  auVar55 = vfmsub231ps_fma(auVar204,auVar55,auVar65);
  auVar26 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar56 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar226 = auVar61._0_4_;
  auVar210._0_4_ = auVar56._0_4_ * fVar226;
  fVar209 = auVar61._4_4_;
  auVar210._4_4_ = auVar56._4_4_ * fVar209;
  fVar221 = auVar61._8_4_;
  auVar210._8_4_ = auVar56._8_4_ * fVar221;
  fVar222 = auVar61._12_4_;
  auVar210._12_4_ = auVar56._12_4_ * fVar222;
  auVar56 = vfmsub231ps_fma(auVar210,auVar55,auVar63);
  auVar63 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar211._0_4_ = auVar56._0_4_ * fVar226;
  auVar211._4_4_ = auVar56._4_4_ * fVar209;
  auVar211._8_4_ = auVar56._8_4_ * fVar221;
  auVar211._12_4_ = auVar56._12_4_ * fVar222;
  auVar55 = vfmsub231ps_fma(auVar211,auVar55,auVar60);
  auVar60 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar188 = auVar55._0_4_;
  auVar252._16_48_ = auVar104._16_48_;
  auVar123._4_60_ = auVar252._4_60_;
  auVar123._0_4_ = fVar188;
  auVar56 = vrsqrt14ss_avx512f(auVar252._0_16_,auVar123._0_16_);
  fVar189 = auVar56._0_4_;
  auVar56 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  fVar223 = fVar189 * 1.5 - auVar56._0_4_ * fVar189 * fVar189 * fVar189;
  auVar56 = vdpps_avx(auVar57,auVar26,0x7f);
  fVar245 = fVar223 * auVar57._0_4_;
  fVar253 = fVar223 * auVar57._4_4_;
  fVar254 = fVar223 * auVar57._8_4_;
  fVar255 = fVar223 * auVar57._12_4_;
  auVar205._0_4_ = fVar188 * auVar26._0_4_;
  auVar205._4_4_ = fVar188 * auVar26._4_4_;
  auVar205._8_4_ = fVar188 * auVar26._8_4_;
  auVar205._12_4_ = fVar188 * auVar26._12_4_;
  fVar188 = auVar56._0_4_;
  auVar178._0_4_ = fVar188 * auVar57._0_4_;
  auVar178._4_4_ = fVar188 * auVar57._4_4_;
  auVar178._8_4_ = fVar188 * auVar57._8_4_;
  auVar178._12_4_ = fVar188 * auVar57._12_4_;
  auVar57 = vsubps_avx(auVar205,auVar178);
  auVar56 = vrcp14ss_avx512f(auVar252._0_16_,auVar123._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar56,ZEXT416(0x40000000));
  fVar188 = auVar56._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar63,auVar63,0x7f);
  fVar189 = auVar55._0_4_;
  auVar103._16_48_ = auVar104._16_48_;
  auVar103._0_16_ = auVar252._0_16_;
  auVar263._4_60_ = auVar103._4_60_;
  auVar263._0_4_ = fVar189;
  auVar56 = vrsqrt14ss_avx512f(auVar252._0_16_,auVar263._0_16_);
  fVar224 = auVar56._0_4_;
  auVar56 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  fVar224 = fVar224 * 1.5 - auVar56._0_4_ * fVar224 * fVar224 * fVar224;
  auVar56 = vdpps_avx(auVar63,auVar60,0x7f);
  fVar233 = fVar224 * auVar63._0_4_;
  fVar242 = fVar224 * auVar63._4_4_;
  fVar243 = fVar224 * auVar63._8_4_;
  fVar244 = fVar224 * auVar63._12_4_;
  auVar168._0_4_ = fVar189 * auVar60._0_4_;
  auVar168._4_4_ = fVar189 * auVar60._4_4_;
  auVar168._8_4_ = fVar189 * auVar60._8_4_;
  auVar168._12_4_ = fVar189 * auVar60._12_4_;
  fVar189 = auVar56._0_4_;
  auVar161._0_4_ = fVar189 * auVar63._0_4_;
  auVar161._4_4_ = fVar189 * auVar63._4_4_;
  auVar161._8_4_ = fVar189 * auVar63._8_4_;
  auVar161._12_4_ = fVar189 * auVar63._12_4_;
  auVar26 = vsubps_avx(auVar168,auVar161);
  auVar56 = vrcp14ss_avx512f(auVar252._0_16_,auVar263._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar56,ZEXT416(0x40000000));
  fVar189 = auVar55._0_4_ * auVar56._0_4_;
  auVar55 = vshufps_avx(auVar138,auVar138,0xff);
  auVar190._0_4_ = fVar245 * auVar55._0_4_;
  auVar190._4_4_ = fVar253 * auVar55._4_4_;
  auVar190._8_4_ = fVar254 * auVar55._8_4_;
  auVar190._12_4_ = fVar255 * auVar55._12_4_;
  local_500 = vsubps_avx(auVar138,auVar190);
  auVar56 = vshufps_avx(auVar64,auVar64,0xff);
  auVar169._0_4_ = auVar56._0_4_ * fVar245 + auVar55._0_4_ * fVar223 * fVar188 * auVar57._0_4_;
  auVar169._4_4_ = auVar56._4_4_ * fVar253 + auVar55._4_4_ * fVar223 * fVar188 * auVar57._4_4_;
  auVar169._8_4_ = auVar56._8_4_ * fVar254 + auVar55._8_4_ * fVar223 * fVar188 * auVar57._8_4_;
  auVar169._12_4_ = auVar56._12_4_ * fVar255 + auVar55._12_4_ * fVar223 * fVar188 * auVar57._12_4_;
  auVar57 = vsubps_avx(auVar64,auVar169);
  local_510._0_4_ = auVar190._0_4_ + auVar138._0_4_;
  local_510._4_4_ = auVar190._4_4_ + auVar138._4_4_;
  fStack_508 = auVar190._8_4_ + auVar138._8_4_;
  fStack_504 = auVar190._12_4_ + auVar138._12_4_;
  auVar125._0_4_ = fVar225 + auVar169._0_4_;
  auVar125._4_4_ = fVar135 + auVar169._4_4_;
  auVar125._8_4_ = fVar136 + auVar169._8_4_;
  auVar125._12_4_ = fVar137 + auVar169._12_4_;
  auVar55 = vshufps_avx(auVar66,auVar66,0xff);
  auVar170._0_4_ = fVar233 * auVar55._0_4_;
  auVar170._4_4_ = fVar242 * auVar55._4_4_;
  auVar170._8_4_ = fVar243 * auVar55._8_4_;
  auVar170._12_4_ = fVar244 * auVar55._12_4_;
  local_520 = vsubps_avx(auVar66,auVar170);
  auVar56 = vshufps_avx(auVar61,auVar61,0xff);
  auVar139._0_4_ = auVar56._0_4_ * fVar233 + auVar55._0_4_ * fVar224 * auVar26._0_4_ * fVar189;
  auVar139._4_4_ = auVar56._4_4_ * fVar242 + auVar55._4_4_ * fVar224 * auVar26._4_4_ * fVar189;
  auVar139._8_4_ = auVar56._8_4_ * fVar243 + auVar55._8_4_ * fVar224 * auVar26._8_4_ * fVar189;
  auVar139._12_4_ = auVar56._12_4_ * fVar244 + auVar55._12_4_ * fVar224 * auVar26._12_4_ * fVar189;
  auVar55 = vsubps_avx(auVar61,auVar139);
  _local_530 = vaddps_avx512vl(auVar66,auVar170);
  auVar140._0_4_ = fVar226 + auVar139._0_4_;
  auVar140._4_4_ = fVar209 + auVar139._4_4_;
  auVar140._8_4_ = fVar221 + auVar139._8_4_;
  auVar140._12_4_ = fVar222 + auVar139._12_4_;
  auVar56 = vmulps_avx512vl(auVar57,auVar59);
  local_540 = vaddps_avx512vl(local_500,auVar56);
  auVar55 = vmulps_avx512vl(auVar55,auVar59);
  local_550 = vsubps_avx512vl(local_520,auVar55);
  auVar55 = vmulps_avx512vl(auVar125,auVar59);
  _local_560 = vaddps_avx512vl(_local_510,auVar55);
  auVar55 = vmulps_avx512vl(auVar140,auVar59);
  _local_570 = vsubps_avx512vl(_local_530,auVar55);
  local_480 = vsubps_avx(local_500,auVar67);
  uVar124 = local_480._0_4_;
  auVar141._4_4_ = uVar124;
  auVar141._0_4_ = uVar124;
  auVar141._8_4_ = uVar124;
  auVar141._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_480,local_480,0x55);
  auVar56 = vshufps_avx(local_480,local_480,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar226 = pre->ray_space[k].vz.field_0.m128[0];
  fVar209 = pre->ray_space[k].vz.field_0.m128[1];
  fVar221 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  auVar126._0_4_ = fVar226 * auVar56._0_4_;
  auVar126._4_4_ = fVar209 * auVar56._4_4_;
  auVar126._8_4_ = fVar221 * auVar56._8_4_;
  auVar126._12_4_ = fVar222 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar2,auVar55);
  auVar60 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar141);
  local_490 = vsubps_avx512vl(local_540,auVar67);
  uVar124 = local_490._0_4_;
  auVar146._4_4_ = uVar124;
  auVar146._0_4_ = uVar124;
  auVar146._8_4_ = uVar124;
  auVar146._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_490,local_490,0x55);
  auVar56 = vshufps_avx(local_490,local_490,0xaa);
  auVar142._0_4_ = fVar226 * auVar56._0_4_;
  auVar142._4_4_ = fVar209 * auVar56._4_4_;
  auVar142._8_4_ = fVar221 * auVar56._8_4_;
  auVar142._12_4_ = fVar222 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar2,auVar55);
  auVar59 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar146);
  local_4a0 = vsubps_avx512vl(local_550,auVar67);
  uVar124 = local_4a0._0_4_;
  auVar171._4_4_ = uVar124;
  auVar171._0_4_ = uVar124;
  auVar171._8_4_ = uVar124;
  auVar171._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar56 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar147._0_4_ = fVar226 * auVar56._0_4_;
  auVar147._4_4_ = fVar209 * auVar56._4_4_;
  auVar147._8_4_ = fVar221 * auVar56._8_4_;
  auVar147._12_4_ = fVar222 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar55);
  auVar61 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar171);
  local_4b0 = vsubps_avx(local_520,auVar67);
  uVar124 = local_4b0._0_4_;
  auVar191._4_4_ = uVar124;
  auVar191._0_4_ = uVar124;
  auVar191._8_4_ = uVar124;
  auVar191._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar56 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar172._0_4_ = fVar226 * auVar56._0_4_;
  auVar172._4_4_ = fVar209 * auVar56._4_4_;
  auVar172._8_4_ = fVar221 * auVar56._8_4_;
  auVar172._12_4_ = fVar222 * auVar56._12_4_;
  auVar55 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar2,auVar55);
  auVar62 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar191);
  local_4c0 = vsubps_avx(_local_510,auVar67);
  uVar124 = local_4c0._0_4_;
  auVar192._4_4_ = uVar124;
  auVar192._0_4_ = uVar124;
  auVar192._8_4_ = uVar124;
  auVar192._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar56 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar212._0_4_ = auVar56._0_4_ * fVar226;
  auVar212._4_4_ = auVar56._4_4_ * fVar209;
  auVar212._8_4_ = auVar56._8_4_ * fVar221;
  auVar212._12_4_ = auVar56._12_4_ * fVar222;
  auVar55 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar55);
  auVar58 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar192);
  local_4d0 = vsubps_avx512vl(_local_560,auVar67);
  uVar124 = local_4d0._0_4_;
  auVar193._4_4_ = uVar124;
  auVar193._0_4_ = uVar124;
  auVar193._8_4_ = uVar124;
  auVar193._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar56 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar227._0_4_ = auVar56._0_4_ * fVar226;
  auVar227._4_4_ = auVar56._4_4_ * fVar209;
  auVar227._8_4_ = auVar56._8_4_ * fVar221;
  auVar227._12_4_ = auVar56._12_4_ * fVar222;
  auVar55 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar2,auVar55);
  auVar64 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar193);
  local_4e0 = vsubps_avx512vl(_local_570,auVar67);
  uVar124 = local_4e0._0_4_;
  auVar194._4_4_ = uVar124;
  auVar194._0_4_ = uVar124;
  auVar194._8_4_ = uVar124;
  auVar194._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar56 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar234._0_4_ = auVar56._0_4_ * fVar226;
  auVar234._4_4_ = auVar56._4_4_ * fVar209;
  auVar234._8_4_ = auVar56._8_4_ * fVar221;
  auVar234._12_4_ = auVar56._12_4_ * fVar222;
  auVar55 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar2,auVar55);
  auVar65 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar194);
  local_4f0 = vsubps_avx512vl(_local_530,auVar67);
  uVar124 = local_4f0._0_4_;
  auVar121._4_4_ = uVar124;
  auVar121._0_4_ = uVar124;
  auVar121._8_4_ = uVar124;
  auVar121._12_4_ = uVar124;
  auVar55 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar56 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar179._0_4_ = auVar56._0_4_ * fVar226;
  auVar179._4_4_ = auVar56._4_4_ * fVar209;
  auVar179._8_4_ = auVar56._8_4_ * fVar221;
  auVar179._12_4_ = auVar56._12_4_ * fVar222;
  auVar55 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar2,auVar55);
  auVar66 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar1,auVar121);
  auVar57 = vmovlhps_avx(auVar60,auVar58);
  auVar26 = vmovlhps_avx(auVar59,auVar64);
  auVar63 = vmovlhps_avx512f(auVar61,auVar65);
  _local_600 = vmovlhps_avx512f(auVar62,auVar66);
  auVar56 = vminps_avx(auVar57,auVar26);
  auVar55 = vmaxps_avx(auVar57,auVar26);
  auVar67 = vminps_avx512vl(auVar63,_local_600);
  auVar56 = vminps_avx(auVar56,auVar67);
  auVar67 = vmaxps_avx512vl(auVar63,_local_600);
  auVar55 = vmaxps_avx(auVar55,auVar67);
  auVar67 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vminps_avx(auVar56,auVar67);
  auVar67 = vshufpd_avx(auVar55,auVar55,3);
  auVar55 = vmaxps_avx(auVar55,auVar67);
  auVar56 = vandps_avx512vl(auVar56,auVar264._0_16_);
  auVar55 = vandps_avx512vl(auVar55,auVar264._0_16_);
  auVar55 = vmaxps_avx(auVar56,auVar55);
  auVar56 = vmovshdup_avx(auVar55);
  auVar55 = vmaxss_avx(auVar56,auVar55);
  local_5e0 = vmovddup_avx512vl(auVar60);
  local_5f0 = vmovddup_avx512vl(auVar59);
  auVar127._8_8_ = auVar61._0_8_;
  auVar127._0_8_ = auVar61._0_8_;
  auVar173._0_8_ = auVar62._0_8_;
  auVar173._8_8_ = auVar173._0_8_;
  local_610 = ZEXT416((uint)(auVar55._0_4_ * 9.536743e-07));
  local_3c0 = vbroadcastss_avx512vl(local_610);
  auVar55 = vxorps_avx512vl(local_3c0._0_16_,auVar262._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar55);
  uVar47 = 0;
  auVar55 = vsubps_avx(auVar26,auVar57);
  auVar67 = vsubps_avx512vl(auVar63,auVar26);
  local_470 = vsubps_avx512vl(_local_600,auVar63);
  local_580 = vsubps_avx(_local_510,local_500);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  local_5a0 = vsubps_avx512vl(_local_570,local_550);
  _local_5b0 = vsubps_avx512vl(_local_530,local_520);
  auVar104 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar104);
  auVar104 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar104);
  auVar56 = ZEXT816(0x3f80000000000000);
  auVar252 = ZEXT1664(auVar56);
  auVar106._32_32_ = auVar104._32_32_;
  do {
    auVar70 = auVar252._0_16_;
    auVar60 = vshufps_avx(auVar70,auVar70,0x50);
    auVar248._8_4_ = 0x3f800000;
    auVar248._0_8_ = &DAT_3f8000003f800000;
    auVar248._12_4_ = 0x3f800000;
    auVar102._16_4_ = 0x3f800000;
    auVar102._0_16_ = auVar248;
    auVar102._20_4_ = 0x3f800000;
    auVar102._24_4_ = 0x3f800000;
    auVar102._28_4_ = 0x3f800000;
    auVar59 = vsubps_avx(auVar248,auVar60);
    fVar226 = auVar60._0_4_;
    fVar188 = auVar58._0_4_;
    auVar148._0_4_ = fVar188 * fVar226;
    fVar209 = auVar60._4_4_;
    fVar189 = auVar58._4_4_;
    auVar148._4_4_ = fVar189 * fVar209;
    fVar221 = auVar60._8_4_;
    auVar148._8_4_ = fVar188 * fVar221;
    fVar222 = auVar60._12_4_;
    auVar148._12_4_ = fVar189 * fVar222;
    fVar135 = auVar64._0_4_;
    auVar156._0_4_ = fVar135 * fVar226;
    fVar136 = auVar64._4_4_;
    auVar156._4_4_ = fVar136 * fVar209;
    auVar156._8_4_ = fVar135 * fVar221;
    auVar156._12_4_ = fVar136 * fVar222;
    fVar137 = auVar65._0_4_;
    auVar162._0_4_ = fVar137 * fVar226;
    fVar233 = auVar65._4_4_;
    auVar162._4_4_ = fVar233 * fVar209;
    auVar162._8_4_ = fVar137 * fVar221;
    auVar162._12_4_ = fVar233 * fVar222;
    fVar242 = auVar66._0_4_;
    auVar128._0_4_ = fVar242 * fVar226;
    fVar243 = auVar66._4_4_;
    auVar128._4_4_ = fVar243 * fVar209;
    auVar128._8_4_ = fVar242 * fVar221;
    auVar128._12_4_ = fVar243 * fVar222;
    auVar61 = vfmadd231ps_avx512vl(auVar148,auVar59,local_5e0);
    auVar62 = vfmadd231ps_avx512vl(auVar156,auVar59,local_5f0);
    auVar68 = vfmadd231ps_avx512vl(auVar162,auVar59,auVar127);
    auVar59 = vfmadd231ps_fma(auVar128,auVar173,auVar59);
    auVar60 = vmovshdup_avx(auVar56);
    fVar209 = auVar56._0_4_;
    fVar226 = (auVar60._0_4_ - fVar209) * 0.04761905;
    auVar95._4_4_ = fVar209;
    auVar95._0_4_ = fVar209;
    auVar95._8_4_ = fVar209;
    auVar95._12_4_ = fVar209;
    auVar95._16_4_ = fVar209;
    auVar95._20_4_ = fVar209;
    auVar95._24_4_ = fVar209;
    auVar95._28_4_ = fVar209;
    auVar98._0_8_ = auVar60._0_8_;
    auVar98._8_8_ = auVar98._0_8_;
    auVar98._16_8_ = auVar98._0_8_;
    auVar98._24_8_ = auVar98._0_8_;
    auVar99 = vsubps_avx(auVar98,auVar95);
    uVar124 = auVar61._0_4_;
    auVar100._4_4_ = uVar124;
    auVar100._0_4_ = uVar124;
    auVar100._8_4_ = uVar124;
    auVar100._12_4_ = uVar124;
    auVar100._16_4_ = uVar124;
    auVar100._20_4_ = uVar124;
    auVar100._24_4_ = uVar124;
    auVar100._28_4_ = uVar124;
    auVar88._8_4_ = 1;
    auVar88._0_8_ = 0x100000001;
    auVar88._12_4_ = 1;
    auVar88._16_4_ = 1;
    auVar88._20_4_ = 1;
    auVar88._24_4_ = 1;
    auVar88._28_4_ = 1;
    auVar97 = ZEXT1632(auVar61);
    auVar96 = vpermps_avx2(auVar88,auVar97);
    auVar82 = vbroadcastss_avx512vl(auVar62);
    auVar98 = ZEXT1632(auVar62);
    auVar83 = vpermps_avx512vl(auVar88,auVar98);
    auVar84 = vbroadcastss_avx512vl(auVar68);
    auVar92 = ZEXT1632(auVar68);
    auVar85 = vpermps_avx512vl(auVar88,auVar92);
    auVar86 = vbroadcastss_avx512vl(auVar59);
    auVar94 = ZEXT1632(auVar59);
    auVar87 = vpermps_avx512vl(auVar88,auVar94);
    auVar101._4_4_ = fVar226;
    auVar101._0_4_ = fVar226;
    auVar101._8_4_ = fVar226;
    auVar101._12_4_ = fVar226;
    auVar101._16_4_ = fVar226;
    auVar101._20_4_ = fVar226;
    auVar101._24_4_ = fVar226;
    auVar101._28_4_ = fVar226;
    auVar93._8_4_ = 2;
    auVar93._0_8_ = 0x200000002;
    auVar93._12_4_ = 2;
    auVar93._16_4_ = 2;
    auVar93._20_4_ = 2;
    auVar93._24_4_ = 2;
    auVar93._28_4_ = 2;
    auVar88 = vpermps_avx512vl(auVar93,auVar97);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar90 = vpermps_avx512vl(auVar89,auVar97);
    auVar97 = vpermps_avx2(auVar93,auVar98);
    auVar91 = vpermps_avx512vl(auVar89,auVar98);
    auVar98 = vpermps_avx2(auVar93,auVar92);
    auVar92 = vpermps_avx512vl(auVar89,auVar92);
    auVar93 = vpermps_avx512vl(auVar93,auVar94);
    auVar89 = vpermps_avx512vl(auVar89,auVar94);
    auVar60 = vfmadd132ps_fma(auVar99,auVar95,_DAT_02020f20);
    auVar99 = vsubps_avx(auVar102,ZEXT1632(auVar60));
    auVar94 = vmulps_avx512vl(auVar82,ZEXT1632(auVar60));
    auVar102 = ZEXT1632(auVar60);
    auVar95 = vmulps_avx512vl(auVar83,auVar102);
    auVar59 = vfmadd231ps_fma(auVar94,auVar99,auVar100);
    auVar61 = vfmadd231ps_fma(auVar95,auVar99,auVar96);
    auVar94 = vmulps_avx512vl(auVar84,auVar102);
    auVar95 = vmulps_avx512vl(auVar85,auVar102);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar82);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar83);
    auVar82 = vmulps_avx512vl(auVar86,auVar102);
    auVar100 = ZEXT1632(auVar60);
    auVar83 = vmulps_avx512vl(auVar87,auVar100);
    auVar84 = vfmadd231ps_avx512vl(auVar82,auVar99,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar85);
    fVar221 = auVar60._0_4_;
    fVar222 = auVar60._4_4_;
    auVar82._4_4_ = fVar222 * auVar94._4_4_;
    auVar82._0_4_ = fVar221 * auVar94._0_4_;
    fVar223 = auVar60._8_4_;
    auVar82._8_4_ = fVar223 * auVar94._8_4_;
    fVar224 = auVar60._12_4_;
    auVar82._12_4_ = fVar224 * auVar94._12_4_;
    auVar82._16_4_ = auVar94._16_4_ * 0.0;
    auVar82._20_4_ = auVar94._20_4_ * 0.0;
    auVar82._24_4_ = auVar94._24_4_ * 0.0;
    auVar82._28_4_ = fVar209;
    auVar83._4_4_ = fVar222 * auVar95._4_4_;
    auVar83._0_4_ = fVar221 * auVar95._0_4_;
    auVar83._8_4_ = fVar223 * auVar95._8_4_;
    auVar83._12_4_ = fVar224 * auVar95._12_4_;
    auVar83._16_4_ = auVar95._16_4_ * 0.0;
    auVar83._20_4_ = auVar95._20_4_ * 0.0;
    auVar83._24_4_ = auVar95._24_4_ * 0.0;
    auVar83._28_4_ = auVar96._28_4_;
    auVar59 = vfmadd231ps_fma(auVar82,auVar99,ZEXT1632(auVar59));
    auVar61 = vfmadd231ps_fma(auVar83,auVar99,ZEXT1632(auVar61));
    auVar87._0_4_ = fVar221 * auVar84._0_4_;
    auVar87._4_4_ = fVar222 * auVar84._4_4_;
    auVar87._8_4_ = fVar223 * auVar84._8_4_;
    auVar87._12_4_ = fVar224 * auVar84._12_4_;
    auVar87._16_4_ = auVar84._16_4_ * 0.0;
    auVar87._20_4_ = auVar84._20_4_ * 0.0;
    auVar87._24_4_ = auVar84._24_4_ * 0.0;
    auVar87._28_4_ = 0;
    auVar96._4_4_ = fVar222 * auVar85._4_4_;
    auVar96._0_4_ = fVar221 * auVar85._0_4_;
    auVar96._8_4_ = fVar223 * auVar85._8_4_;
    auVar96._12_4_ = fVar224 * auVar85._12_4_;
    auVar96._16_4_ = auVar85._16_4_ * 0.0;
    auVar96._20_4_ = auVar85._20_4_ * 0.0;
    auVar96._24_4_ = auVar85._24_4_ * 0.0;
    auVar96._28_4_ = auVar84._28_4_;
    auVar62 = vfmadd231ps_fma(auVar87,auVar99,auVar94);
    auVar68 = vfmadd231ps_fma(auVar96,auVar99,auVar95);
    auVar84._28_4_ = auVar95._28_4_;
    auVar84._0_28_ =
         ZEXT1628(CONCAT412(fVar224 * auVar68._12_4_,
                            CONCAT48(fVar223 * auVar68._8_4_,
                                     CONCAT44(fVar222 * auVar68._4_4_,fVar221 * auVar68._0_4_))));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar224 * auVar62._12_4_,
                                                 CONCAT48(fVar223 * auVar62._8_4_,
                                                          CONCAT44(fVar222 * auVar62._4_4_,
                                                                   fVar221 * auVar62._0_4_)))),
                              auVar99,ZEXT1632(auVar59));
    auVar80 = vfmadd231ps_fma(auVar84,auVar99,ZEXT1632(auVar61));
    auVar96 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar59));
    auVar82 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar61));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar96 = vmulps_avx512vl(auVar96,auVar83);
    auVar82 = vmulps_avx512vl(auVar82,auVar83);
    auVar94._0_4_ = fVar226 * auVar96._0_4_;
    auVar94._4_4_ = fVar226 * auVar96._4_4_;
    auVar94._8_4_ = fVar226 * auVar96._8_4_;
    auVar94._12_4_ = fVar226 * auVar96._12_4_;
    auVar94._16_4_ = fVar226 * auVar96._16_4_;
    auVar94._20_4_ = fVar226 * auVar96._20_4_;
    auVar94._24_4_ = fVar226 * auVar96._24_4_;
    auVar94._28_4_ = 0;
    auVar96 = vmulps_avx512vl(auVar101,auVar82);
    auVar62 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar134._0_4_ = auVar94._0_4_ + auVar69._0_4_;
    auVar134._4_4_ = auVar94._4_4_ + auVar69._4_4_;
    auVar134._8_4_ = auVar94._8_4_ + auVar69._8_4_;
    auVar134._12_4_ = auVar94._12_4_ + auVar69._12_4_;
    auVar134._16_4_ = auVar94._16_4_ + 0.0;
    auVar134._20_4_ = auVar94._20_4_ + 0.0;
    auVar134._24_4_ = auVar94._24_4_ + 0.0;
    auVar134._28_4_ = 0;
    auVar95 = ZEXT1632(auVar62);
    auVar85 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar95);
    auVar86 = vaddps_avx512vl(ZEXT1632(auVar80),auVar96);
    auVar87 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar95);
    auVar96 = vsubps_avx(auVar82,auVar85);
    auVar87 = vsubps_avx512vl(auVar84,auVar87);
    auVar85 = vmulps_avx512vl(auVar97,auVar100);
    auVar94 = vmulps_avx512vl(auVar91,auVar100);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar88);
    auVar88 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar90);
    auVar90 = vmulps_avx512vl(auVar98,auVar100);
    auVar94 = vmulps_avx512vl(auVar92,auVar100);
    auVar97 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar97);
    auVar90 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar91);
    auVar91 = vmulps_avx512vl(auVar93,auVar100);
    auVar89 = vmulps_avx512vl(auVar89,auVar100);
    auVar59 = vfmadd231ps_fma(auVar91,auVar99,auVar98);
    auVar61 = vfmadd231ps_fma(auVar89,auVar99,auVar92);
    auVar89 = vmulps_avx512vl(auVar100,auVar97);
    auVar91 = vmulps_avx512vl(ZEXT1632(auVar60),auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar85);
    auVar88 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar88);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar59._12_4_,
                                            CONCAT48(fVar223 * auVar59._8_4_,
                                                     CONCAT44(fVar222 * auVar59._4_4_,
                                                              fVar221 * auVar59._0_4_)))),auVar99,
                         auVar97);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar224 * auVar61._12_4_,
                                            CONCAT48(fVar223 * auVar61._8_4_,
                                                     CONCAT44(fVar222 * auVar61._4_4_,
                                                              fVar221 * auVar61._0_4_)))),auVar99,
                         auVar90);
    auVar97._4_4_ = fVar222 * auVar91._4_4_;
    auVar97._0_4_ = fVar221 * auVar91._0_4_;
    auVar97._8_4_ = fVar223 * auVar91._8_4_;
    auVar97._12_4_ = fVar224 * auVar91._12_4_;
    auVar97._16_4_ = auVar91._16_4_ * 0.0;
    auVar97._20_4_ = auVar91._20_4_ * 0.0;
    auVar97._24_4_ = auVar91._24_4_ * 0.0;
    auVar97._28_4_ = auVar92._28_4_;
    auVar85._4_4_ = fVar222 * auVar90._4_4_;
    auVar85._0_4_ = fVar221 * auVar90._0_4_;
    auVar85._8_4_ = fVar223 * auVar90._8_4_;
    auVar85._12_4_ = fVar224 * auVar90._12_4_;
    auVar85._16_4_ = auVar90._16_4_ * 0.0;
    auVar85._20_4_ = auVar90._20_4_ * 0.0;
    auVar85._24_4_ = auVar90._24_4_ * 0.0;
    auVar85._28_4_ = auVar98._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar89);
    auVar98 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar99);
    auVar99 = vsubps_avx512vl(auVar91,auVar89);
    auVar85 = vsubps_avx512vl(auVar90,auVar88);
    auVar88 = vmulps_avx512vl(auVar99,auVar83);
    auVar83 = vmulps_avx512vl(auVar85,auVar83);
    fVar209 = fVar226 * auVar88._0_4_;
    fVar221 = fVar226 * auVar88._4_4_;
    auVar99._4_4_ = fVar221;
    auVar99._0_4_ = fVar209;
    fVar222 = fVar226 * auVar88._8_4_;
    auVar99._8_4_ = fVar222;
    fVar223 = fVar226 * auVar88._12_4_;
    auVar99._12_4_ = fVar223;
    fVar224 = fVar226 * auVar88._16_4_;
    auVar99._16_4_ = fVar224;
    fVar225 = fVar226 * auVar88._20_4_;
    auVar99._20_4_ = fVar225;
    fVar226 = fVar226 * auVar88._24_4_;
    auVar99._24_4_ = fVar226;
    auVar99._28_4_ = auVar88._28_4_;
    auVar83 = vmulps_avx512vl(auVar101,auVar83);
    auVar85 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar95);
    auVar89 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar95);
    auVar208._0_4_ = auVar97._0_4_ + fVar209;
    auVar208._4_4_ = auVar97._4_4_ + fVar221;
    auVar208._8_4_ = auVar97._8_4_ + fVar222;
    auVar208._12_4_ = auVar97._12_4_ + fVar223;
    auVar208._16_4_ = auVar97._16_4_ + fVar224;
    auVar208._20_4_ = auVar97._20_4_ + fVar225;
    auVar208._24_4_ = auVar97._24_4_ + fVar226;
    auVar208._28_4_ = auVar97._28_4_ + auVar88._28_4_;
    auVar99 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar88 = vaddps_avx512vl(auVar98,auVar83);
    auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar99 = vsubps_avx(auVar85,auVar99);
    auVar83 = vsubps_avx512vl(auVar89,auVar83);
    auVar155 = ZEXT1632(auVar69);
    auVar90 = vsubps_avx512vl(auVar97,auVar155);
    auVar160 = ZEXT1632(auVar80);
    auVar91 = vsubps_avx512vl(auVar98,auVar160);
    auVar92 = vsubps_avx512vl(auVar85,auVar82);
    auVar90 = vaddps_avx512vl(auVar90,auVar92);
    auVar92 = vsubps_avx512vl(auVar89,auVar84);
    auVar91 = vaddps_avx512vl(auVar91,auVar92);
    auVar92 = vmulps_avx512vl(auVar160,auVar90);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar155,auVar91);
    auVar93 = vmulps_avx512vl(auVar86,auVar90);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar134,auVar91);
    auVar94 = vmulps_avx512vl(auVar87,auVar90);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar96,auVar91);
    auVar95 = vmulps_avx512vl(auVar84,auVar90);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar82,auVar91);
    auVar100 = vmulps_avx512vl(auVar98,auVar90);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar97,auVar91);
    auVar101 = vmulps_avx512vl(auVar88,auVar90);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar208,auVar91);
    auVar102 = vmulps_avx512vl(auVar83,auVar90);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar99,auVar91);
    auVar90 = vmulps_avx512vl(auVar89,auVar90);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar85,auVar91);
    auVar91 = vminps_avx512vl(auVar92,auVar93);
    auVar92 = vmaxps_avx512vl(auVar92,auVar93);
    auVar93 = vminps_avx512vl(auVar94,auVar95);
    auVar91 = vminps_avx512vl(auVar91,auVar93);
    auVar93 = vmaxps_avx512vl(auVar94,auVar95);
    auVar92 = vmaxps_avx512vl(auVar92,auVar93);
    auVar93 = vminps_avx512vl(auVar100,auVar101);
    auVar94 = vmaxps_avx512vl(auVar100,auVar101);
    auVar95 = vminps_avx512vl(auVar102,auVar90);
    auVar93 = vminps_avx512vl(auVar93,auVar95);
    auVar91 = vminps_avx512vl(auVar91,auVar93);
    auVar90 = vmaxps_avx512vl(auVar102,auVar90);
    auVar90 = vmaxps_avx512vl(auVar94,auVar90);
    auVar90 = vmaxps_avx512vl(auVar92,auVar90);
    uVar27 = vcmpps_avx512vl(auVar91,local_3c0,2);
    uVar28 = vcmpps_avx512vl(auVar90,local_3e0,5);
    uVar49 = 0;
    bVar45 = (byte)uVar27 & (byte)uVar28 & 0x7f;
    if (bVar45 != 0) {
      auVar90 = vsubps_avx512vl(auVar82,auVar155);
      auVar91 = vsubps_avx512vl(auVar84,auVar160);
      auVar92 = vsubps_avx512vl(auVar85,auVar97);
      auVar90 = vaddps_avx512vl(auVar90,auVar92);
      auVar92 = vsubps_avx512vl(auVar89,auVar98);
      auVar91 = vaddps_avx512vl(auVar91,auVar92);
      auVar92 = vmulps_avx512vl(auVar160,auVar90);
      auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar91,auVar155);
      auVar86 = vmulps_avx512vl(auVar86,auVar90);
      auVar86 = vfnmadd213ps_avx512vl(auVar134,auVar91,auVar86);
      auVar87 = vmulps_avx512vl(auVar87,auVar90);
      auVar87 = vfnmadd213ps_avx512vl(auVar96,auVar91,auVar87);
      auVar96 = vmulps_avx512vl(auVar84,auVar90);
      auVar84 = vfnmadd231ps_avx512vl(auVar96,auVar91,auVar82);
      auVar96 = vmulps_avx512vl(auVar98,auVar90);
      auVar98 = vfnmadd231ps_avx512vl(auVar96,auVar91,auVar97);
      auVar96 = vmulps_avx512vl(auVar88,auVar90);
      auVar88 = vfnmadd213ps_avx512vl(auVar208,auVar91,auVar96);
      auVar96 = vmulps_avx512vl(auVar83,auVar90);
      auVar83 = vfnmadd213ps_avx512vl(auVar99,auVar91,auVar96);
      auVar99 = vmulps_avx512vl(auVar89,auVar90);
      auVar85 = vfnmadd231ps_avx512vl(auVar99,auVar85,auVar91);
      auVar96 = vminps_avx(auVar92,auVar86);
      auVar99 = vmaxps_avx(auVar92,auVar86);
      auVar82 = vminps_avx(auVar87,auVar84);
      auVar82 = vminps_avx(auVar96,auVar82);
      auVar96 = vmaxps_avx(auVar87,auVar84);
      auVar99 = vmaxps_avx(auVar99,auVar96);
      auVar97 = vminps_avx(auVar98,auVar88);
      auVar96 = vmaxps_avx(auVar98,auVar88);
      auVar98 = vminps_avx(auVar83,auVar85);
      auVar97 = vminps_avx(auVar97,auVar98);
      auVar97 = vminps_avx(auVar82,auVar97);
      auVar82 = vmaxps_avx(auVar83,auVar85);
      auVar96 = vmaxps_avx(auVar96,auVar82);
      auVar99 = vmaxps_avx(auVar99,auVar96);
      uVar27 = vcmpps_avx512vl(auVar99,local_3e0,5);
      uVar28 = vcmpps_avx512vl(auVar97,local_3c0,2);
      uVar49 = (uint)(bVar45 & (byte)uVar27 & (byte)uVar28);
    }
    if (uVar49 != 0) {
      auStack_5d0[uVar47] = uVar49;
      uVar27 = vmovlps_avx(auVar56);
      *(undefined8 *)(&uStack_460 + uVar47 * 2) = uVar27;
      uVar51 = vmovlps_avx512f(auVar70);
      auStack_3a0[uVar47] = uVar51;
      uVar47 = (ulong)((int)uVar47 + 1);
    }
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar123 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar262 = ZEXT1664(auVar56);
    auVar105._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar105._32_32_ = auVar106._32_32_;
    in_ZMM19 = ZEXT3264(auVar105._0_32_);
    auVar263 = ZEXT464(0x3f800000);
    auVar104._16_48_ = auVar105._16_48_;
    do {
      auVar106._32_32_ = auVar104._32_32_;
      if ((int)uVar47 == 0) {
        uVar124 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar124;
        auVar30._0_4_ = uVar124;
        auVar30._8_4_ = uVar124;
        auVar30._12_4_ = uVar124;
        uVar27 = vcmpps_avx512vl(local_5c0,auVar30,2);
        uVar53 = (uint)uVar54 & (uint)uVar54 + 0xf & (uint)uVar27;
        uVar54 = (ulong)uVar53;
        if (uVar53 == 0) {
          return;
        }
        goto LAB_01b43135;
      }
      uVar46 = (int)uVar47 - 1;
      uVar48 = (ulong)uVar46;
      uVar49 = (&uStack_460)[uVar48 * 2];
      fVar226 = afStack_45c[uVar48 * 2];
      uVar5 = auStack_5d0[uVar48];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = auStack_3a0[uVar48];
      auVar252 = ZEXT1664(auVar249);
      lVar52 = 0;
      for (uVar51 = (ulong)uVar5; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
        lVar52 = lVar52 + 1;
      }
      uVar50 = uVar5 - 1 & uVar5;
      auStack_5d0[uVar48] = uVar50;
      if (uVar50 == 0) {
        uVar47 = (ulong)uVar46;
      }
      auVar143._0_4_ = (float)lVar52;
      auVar143._4_8_ = SUB128(ZEXT812(0),4);
      auVar143._12_4_ = 0;
      auVar56 = vmulss_avx512f(auVar143,SUB6416(ZEXT464(0x3e124925),0));
      lVar52 = lVar52 + 1;
      auVar60 = vmulss_avx512f(ZEXT416((uint)(float)lVar52),SUB6416(ZEXT464(0x3e124925),0));
      auVar61 = auVar263._0_16_;
      auVar59 = vsubss_avx512f(auVar61,auVar56);
      auVar56 = vmulss_avx512f(ZEXT416((uint)fVar226),auVar56);
      auVar59 = vfmadd231ss_avx512f(auVar56,ZEXT416(uVar49),auVar59);
      auVar56 = vsubss_avx512f(auVar61,auVar60);
      auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar60._0_4_)),ZEXT416(uVar49),auVar56);
      auVar60 = vsubss_avx512f(auVar56,auVar59);
      vucomiss_avx512f(auVar60);
      if (uVar5 == 0 || lVar52 == 0) break;
      auVar62 = vshufps_avx(auVar249,auVar249,0x50);
      vucomiss_avx512f(auVar60);
      auVar246 = auVar265._0_16_;
      auVar69 = vsubps_avx512vl(auVar246,auVar62);
      fVar226 = auVar62._0_4_;
      auVar149._0_4_ = fVar188 * fVar226;
      fVar209 = auVar62._4_4_;
      auVar149._4_4_ = fVar189 * fVar209;
      fVar221 = auVar62._8_4_;
      auVar149._8_4_ = fVar188 * fVar221;
      fVar222 = auVar62._12_4_;
      auVar149._12_4_ = fVar189 * fVar222;
      auVar157._0_4_ = fVar135 * fVar226;
      auVar157._4_4_ = fVar136 * fVar209;
      auVar157._8_4_ = fVar135 * fVar221;
      auVar157._12_4_ = fVar136 * fVar222;
      auVar163._0_4_ = fVar137 * fVar226;
      auVar163._4_4_ = fVar233 * fVar209;
      auVar163._8_4_ = fVar137 * fVar221;
      auVar163._12_4_ = fVar233 * fVar222;
      auVar129._0_4_ = fVar242 * fVar226;
      auVar129._4_4_ = fVar243 * fVar209;
      auVar129._8_4_ = fVar242 * fVar221;
      auVar129._12_4_ = fVar243 * fVar222;
      auVar62 = vfmadd231ps_fma(auVar149,auVar69,local_5e0);
      auVar68 = vfmadd231ps_fma(auVar157,auVar69,local_5f0);
      auVar70 = vfmadd231ps_avx512vl(auVar163,auVar69,auVar127);
      auVar69 = vfmadd231ps_fma(auVar129,auVar173,auVar69);
      auVar86._16_16_ = auVar62;
      auVar86._0_16_ = auVar62;
      auVar89._16_16_ = auVar68;
      auVar89._0_16_ = auVar68;
      auVar91._16_16_ = auVar70;
      auVar91._0_16_ = auVar70;
      uVar124 = auVar59._0_4_;
      auVar92._4_4_ = uVar124;
      auVar92._0_4_ = uVar124;
      auVar92._8_4_ = uVar124;
      auVar92._12_4_ = uVar124;
      uVar124 = auVar56._0_4_;
      auVar92._20_4_ = uVar124;
      auVar92._16_4_ = uVar124;
      auVar92._24_4_ = uVar124;
      auVar92._28_4_ = uVar124;
      auVar99 = vsubps_avx(auVar89,auVar86);
      auVar68 = vfmadd213ps_fma(auVar99,auVar92,auVar86);
      auVar99 = vsubps_avx(auVar91,auVar89);
      auVar80 = vfmadd213ps_fma(auVar99,auVar92,auVar89);
      auVar62 = vsubps_avx(auVar69,auVar70);
      auVar90._16_16_ = auVar62;
      auVar90._0_16_ = auVar62;
      auVar62 = vfmadd213ps_fma(auVar90,auVar92,auVar91);
      auVar99 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar68));
      auVar68 = vfmadd213ps_fma(auVar99,auVar92,ZEXT1632(auVar68));
      auVar99 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar80));
      auVar62 = vfmadd213ps_fma(auVar99,auVar92,ZEXT1632(auVar80));
      auVar99 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar68));
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar99,auVar92);
      auVar106._0_32_ = vmulps_avx512vl(auVar99,in_ZMM19._0_32_);
      auVar104._16_48_ = auVar106._16_48_;
      auVar62 = vmulss_avx512f(auVar60,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar226 = auVar62._0_4_;
      auVar164._0_8_ =
           CONCAT44(auVar75._4_4_ + fVar226 * auVar106._4_4_,
                    auVar75._0_4_ + fVar226 * auVar106._0_4_);
      auVar164._8_4_ = auVar75._8_4_ + fVar226 * auVar106._8_4_;
      auVar164._12_4_ = auVar75._12_4_ + fVar226 * auVar106._12_4_;
      auVar150._0_4_ = fVar226 * auVar106._16_4_;
      auVar150._4_4_ = fVar226 * auVar106._20_4_;
      auVar150._8_4_ = fVar226 * auVar106._24_4_;
      auVar150._12_4_ = fVar226 * auVar106._28_4_;
      auVar81 = vsubps_avx((undefined1  [16])0x0,auVar150);
      auVar78 = vshufpd_avx(auVar75,auVar75,3);
      auVar76 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar62 = vsubps_avx(auVar78,auVar75);
      auVar68 = vsubps_avx(auVar76,(undefined1  [16])0x0);
      auVar180._0_4_ = auVar68._0_4_ + auVar62._0_4_;
      auVar180._4_4_ = auVar68._4_4_ + auVar62._4_4_;
      auVar180._8_4_ = auVar68._8_4_ + auVar62._8_4_;
      auVar180._12_4_ = auVar68._12_4_ + auVar62._12_4_;
      auVar62 = vshufps_avx(auVar75,auVar75,0xb1);
      auVar68 = vshufps_avx(auVar164,auVar164,0xb1);
      auVar69 = vshufps_avx(auVar81,auVar81,0xb1);
      auVar80 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar235._4_4_ = auVar180._0_4_;
      auVar235._0_4_ = auVar180._0_4_;
      auVar235._8_4_ = auVar180._0_4_;
      auVar235._12_4_ = auVar180._0_4_;
      auVar70 = vshufps_avx(auVar180,auVar180,0x55);
      fVar226 = auVar70._0_4_;
      auVar195._0_4_ = auVar62._0_4_ * fVar226;
      fVar209 = auVar70._4_4_;
      auVar195._4_4_ = auVar62._4_4_ * fVar209;
      fVar221 = auVar70._8_4_;
      auVar195._8_4_ = auVar62._8_4_ * fVar221;
      fVar222 = auVar70._12_4_;
      auVar195._12_4_ = auVar62._12_4_ * fVar222;
      auVar206._0_4_ = auVar68._0_4_ * fVar226;
      auVar206._4_4_ = auVar68._4_4_ * fVar209;
      auVar206._8_4_ = auVar68._8_4_ * fVar221;
      auVar206._12_4_ = auVar68._12_4_ * fVar222;
      auVar213._0_4_ = auVar69._0_4_ * fVar226;
      auVar213._4_4_ = auVar69._4_4_ * fVar209;
      auVar213._8_4_ = auVar69._8_4_ * fVar221;
      auVar213._12_4_ = auVar69._12_4_ * fVar222;
      auVar181._0_4_ = auVar80._0_4_ * fVar226;
      auVar181._4_4_ = auVar80._4_4_ * fVar209;
      auVar181._8_4_ = auVar80._8_4_ * fVar221;
      auVar181._12_4_ = auVar80._12_4_ * fVar222;
      auVar62 = vfmadd231ps_fma(auVar195,auVar235,auVar75);
      auVar68 = vfmadd231ps_fma(auVar206,auVar235,auVar164);
      auVar70 = vfmadd231ps_fma(auVar213,auVar235,auVar81);
      auVar74 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar235);
      auVar77 = vshufpd_avx(auVar62,auVar62,1);
      auVar71 = vshufpd_avx(auVar68,auVar68,1);
      auVar72 = vshufpd_avx(auVar70,auVar70,1);
      auVar73 = vshufpd_avx(auVar74,auVar74,1);
      auVar69 = vminss_avx(auVar62,auVar68);
      auVar62 = vmaxss_avx(auVar68,auVar62);
      auVar80 = vminss_avx(auVar70,auVar74);
      auVar68 = vmaxss_avx(auVar74,auVar70);
      auVar80 = vminss_avx(auVar69,auVar80);
      auVar62 = vmaxss_avx(auVar68,auVar62);
      auVar70 = vminss_avx(auVar77,auVar71);
      auVar68 = vmaxss_avx(auVar71,auVar77);
      auVar77 = vminss_avx(auVar72,auVar73);
      auVar69 = vmaxss_avx(auVar73,auVar72);
      auVar70 = vminss_avx(auVar70,auVar77);
      auVar68 = vmaxss_avx(auVar69,auVar68);
      vucomiss_avx512f(auVar80);
      fVar209 = auVar68._0_4_;
      fVar226 = auVar62._0_4_;
      if (((uint)uVar47 < 5) || (fVar209 <= -0.0001)) {
        uVar27 = vcmpps_avx512vl(auVar70,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar28 = vcmpps_avx512vl(auVar80,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar226 & ((byte)uVar28 | (byte)uVar27)) != 0) goto LAB_01b44026;
        uVar27 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar68,5);
        uVar28 = vcmpps_avx512vl(auVar70,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar28 | (ushort)uVar27) & 1) == 0) goto LAB_01b44026;
        bVar10 = true;
        auVar252 = ZEXT1664(auVar249);
      }
      else {
LAB_01b44026:
        auVar71 = auVar267._0_16_;
        uVar27 = vcmpss_avx512f(auVar80,auVar71,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        iVar119 = auVar263._0_4_;
        fVar221 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        uVar27 = vcmpss_avx512f(auVar62,auVar71,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar222 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        bVar10 = fVar221 != fVar222;
        iVar266 = auVar267._0_4_;
        auVar104._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar107._4_60_ = auVar104._4_60_;
        auVar107._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
        auVar77 = auVar107._0_16_;
        auVar109._16_48_ = auVar104._16_48_;
        auVar109._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar108._4_60_ = auVar109._4_60_;
        auVar108._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * -0x800000;
        auVar69 = auVar108._0_16_;
        uVar27 = vcmpss_avx512f(auVar70,auVar71,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar223 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        if ((fVar221 != fVar223) || (NAN(fVar221) || NAN(fVar223))) {
          fVar224 = auVar70._0_4_;
          fVar221 = auVar80._0_4_;
          bVar10 = fVar224 == fVar221;
          if ((!bVar10) || (NAN(fVar224) || NAN(fVar221))) {
            auVar80 = vxorps_avx512vl(auVar80,auVar262._0_16_);
            auVar256._0_4_ = auVar80._0_4_ / (fVar224 - fVar221);
            auVar256._4_12_ = auVar80._4_12_;
            auVar80 = vsubss_avx512f(auVar61,auVar256);
            auVar70 = vfmadd213ss_avx512f(auVar80,auVar71,auVar256);
            auVar80 = auVar70;
          }
          else {
            vucomiss_avx512f(auVar71);
            auVar111._16_48_ = auVar104._16_48_;
            auVar111._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar110._4_60_ = auVar111._4_60_;
            auVar110._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
            auVar70 = auVar110._0_16_;
            auVar80 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar77 = vminss_avx(auVar77,auVar70);
          auVar69 = vmaxss_avx(auVar80,auVar69);
        }
        uVar27 = vcmpss_avx512f(auVar68,auVar71,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar221 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        if ((fVar222 != fVar221) || (NAN(fVar222) || NAN(fVar221))) {
          bVar10 = fVar209 == fVar226;
          if ((!bVar10) || (NAN(fVar209) || NAN(fVar226))) {
            auVar62 = vxorps_avx512vl(auVar62,auVar262._0_16_);
            auVar214._0_4_ = auVar62._0_4_ / (fVar209 - fVar226);
            auVar214._4_12_ = auVar62._4_12_;
            auVar62 = vsubss_avx512f(auVar61,auVar214);
            auVar68 = vfmadd213ss_avx512f(auVar62,auVar71,auVar214);
            auVar62 = auVar68;
          }
          else {
            vucomiss_avx512f(auVar71);
            auVar113._16_48_ = auVar104._16_48_;
            auVar113._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar112._4_60_ = auVar113._4_60_;
            auVar112._0_4_ = (uint)bVar10 * iVar266 + (uint)!bVar10 * 0x7f800000;
            auVar68 = auVar112._0_16_;
            auVar62 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar77 = vminss_avx(auVar77,auVar68);
          auVar69 = vmaxss_avx(auVar62,auVar69);
        }
        bVar10 = fVar223 != fVar221;
        auVar62 = vminss_avx512f(auVar77,auVar61);
        auVar115._16_48_ = auVar104._16_48_;
        auVar115._0_16_ = auVar77;
        auVar114._4_60_ = auVar115._4_60_;
        auVar114._0_4_ = (uint)bVar10 * auVar62._0_4_ + (uint)!bVar10 * auVar77._0_4_;
        auVar62 = vmaxss_avx512f(auVar61,auVar69);
        auVar117._16_48_ = auVar104._16_48_;
        auVar117._0_16_ = auVar69;
        auVar116._4_60_ = auVar117._4_60_;
        auVar116._0_4_ = (uint)bVar10 * auVar62._0_4_ + (uint)!bVar10 * auVar69._0_4_;
        auVar62 = vmaxss_avx512f(auVar71,auVar114._0_16_);
        auVar68 = vminss_avx512f(auVar116._0_16_,auVar61);
        bVar10 = true;
        if (auVar62._0_4_ <= auVar68._0_4_) {
          auVar71 = vmaxss_avx512f(auVar71,ZEXT416((uint)(auVar62._0_4_ + -0.1)));
          auVar72 = vminss_avx512f(ZEXT416((uint)(auVar68._0_4_ + 0.1)),auVar61);
          auVar130._0_8_ = auVar75._0_8_;
          auVar130._8_8_ = auVar130._0_8_;
          auVar207._8_8_ = auVar164._0_8_;
          auVar207._0_8_ = auVar164._0_8_;
          auVar215._8_8_ = auVar81._0_8_;
          auVar215._0_8_ = auVar81._0_8_;
          auVar62 = vshufpd_avx(auVar164,auVar164,3);
          auVar68 = vshufpd_avx(auVar81,auVar81,3);
          auVar69 = vshufps_avx(auVar71,auVar72,0);
          auVar73 = vsubps_avx512vl(auVar246,auVar69);
          fVar226 = auVar69._0_4_;
          auVar250._0_4_ = fVar226 * auVar78._0_4_;
          fVar209 = auVar69._4_4_;
          auVar250._4_4_ = fVar209 * auVar78._4_4_;
          fVar221 = auVar69._8_4_;
          auVar250._8_4_ = fVar221 * auVar78._8_4_;
          fVar222 = auVar69._12_4_;
          auVar250._12_4_ = fVar222 * auVar78._12_4_;
          auVar165._0_4_ = fVar226 * auVar62._0_4_;
          auVar165._4_4_ = fVar209 * auVar62._4_4_;
          auVar165._8_4_ = fVar221 * auVar62._8_4_;
          auVar165._12_4_ = fVar222 * auVar62._12_4_;
          auVar174._0_4_ = fVar226 * auVar68._0_4_;
          auVar174._4_4_ = fVar209 * auVar68._4_4_;
          auVar174._8_4_ = fVar221 * auVar68._8_4_;
          auVar174._12_4_ = fVar222 * auVar68._12_4_;
          auVar151._0_4_ = fVar226 * auVar76._0_4_;
          auVar151._4_4_ = fVar209 * auVar76._4_4_;
          auVar151._8_4_ = fVar221 * auVar76._8_4_;
          auVar151._12_4_ = fVar222 * auVar76._12_4_;
          auVar80 = vfmadd231ps_fma(auVar250,auVar73,auVar130);
          auVar70 = vfmadd231ps_fma(auVar165,auVar73,auVar207);
          auVar77 = vfmadd231ps_fma(auVar174,auVar73,auVar215);
          auVar78 = vfmadd231ps_fma(auVar151,auVar73,ZEXT816(0));
          auVar62 = vsubss_avx512f(auVar61,auVar71);
          auVar68 = vmovshdup_avx512vl(auVar249);
          auVar74 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar71._0_4_)),auVar249,
                                        auVar62);
          auVar62 = vsubss_avx512f(auVar61,auVar72);
          auVar75 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar72._0_4_ * auVar68._0_4_)),auVar249,
                                        auVar62);
          auVar76 = vdivss_avx512f(auVar61,auVar60);
          auVar60 = vsubps_avx(auVar70,auVar80);
          auVar261 = auVar123._0_16_;
          auVar68 = vmulps_avx512vl(auVar60,auVar261);
          auVar60 = vsubps_avx(auVar77,auVar70);
          auVar69 = vmulps_avx512vl(auVar60,auVar261);
          auVar60 = vsubps_avx(auVar78,auVar77);
          auVar60 = vmulps_avx512vl(auVar60,auVar261);
          auVar62 = vminps_avx(auVar69,auVar60);
          auVar60 = vmaxps_avx(auVar69,auVar60);
          auVar62 = vminps_avx(auVar68,auVar62);
          auVar60 = vmaxps_avx(auVar68,auVar60);
          auVar68 = vshufpd_avx(auVar62,auVar62,3);
          auVar69 = vshufpd_avx(auVar60,auVar60,3);
          auVar62 = vminps_avx(auVar62,auVar68);
          auVar60 = vmaxps_avx(auVar60,auVar69);
          fVar226 = auVar76._0_4_;
          auVar196._0_4_ = fVar226 * auVar62._0_4_;
          auVar196._4_4_ = fVar226 * auVar62._4_4_;
          auVar196._8_4_ = fVar226 * auVar62._8_4_;
          auVar196._12_4_ = fVar226 * auVar62._12_4_;
          auVar182._0_4_ = fVar226 * auVar60._0_4_;
          auVar182._4_4_ = fVar226 * auVar60._4_4_;
          auVar182._8_4_ = fVar226 * auVar60._8_4_;
          auVar182._12_4_ = fVar226 * auVar60._12_4_;
          auVar76 = vdivss_avx512f(auVar61,ZEXT416((uint)(auVar75._0_4_ - auVar74._0_4_)));
          auVar60 = vshufpd_avx(auVar80,auVar80,3);
          auVar62 = vshufpd_avx(auVar70,auVar70,3);
          auVar68 = vshufpd_avx(auVar77,auVar77,3);
          auVar69 = vshufpd_avx(auVar78,auVar78,3);
          auVar60 = vsubps_avx(auVar60,auVar80);
          auVar80 = vsubps_avx(auVar62,auVar70);
          auVar70 = vsubps_avx(auVar68,auVar77);
          auVar69 = vsubps_avx(auVar69,auVar78);
          auVar62 = vminps_avx(auVar60,auVar80);
          auVar60 = vmaxps_avx(auVar60,auVar80);
          auVar68 = vminps_avx(auVar70,auVar69);
          auVar68 = vminps_avx(auVar62,auVar68);
          auVar62 = vmaxps_avx(auVar70,auVar69);
          auVar60 = vmaxps_avx(auVar60,auVar62);
          fVar226 = auVar76._0_4_;
          auVar216._0_4_ = fVar226 * auVar68._0_4_;
          auVar216._4_4_ = fVar226 * auVar68._4_4_;
          auVar216._8_4_ = fVar226 * auVar68._8_4_;
          auVar216._12_4_ = fVar226 * auVar68._12_4_;
          auVar228._0_4_ = fVar226 * auVar60._0_4_;
          auVar228._4_4_ = fVar226 * auVar60._4_4_;
          auVar228._8_4_ = fVar226 * auVar60._8_4_;
          auVar228._12_4_ = fVar226 * auVar60._12_4_;
          auVar81 = vinsertps_avx512f(auVar59,auVar74,0x10);
          auVar80 = vinsertps_avx(auVar56,auVar75,0x10);
          auVar122._0_4_ = auVar81._0_4_ + auVar80._0_4_;
          auVar122._4_4_ = auVar81._4_4_ + auVar80._4_4_;
          auVar122._8_4_ = auVar81._8_4_ + auVar80._8_4_;
          auVar122._12_4_ = auVar81._12_4_ + auVar80._12_4_;
          auVar29._8_4_ = 0x3f000000;
          auVar29._0_8_ = 0x3f0000003f000000;
          auVar29._12_4_ = 0x3f000000;
          auVar72 = vmulps_avx512vl(auVar122,auVar29);
          auVar68 = vshufps_avx(auVar72,auVar72,0x54);
          uVar124 = auVar72._0_4_;
          auVar144._4_4_ = uVar124;
          auVar144._0_4_ = uVar124;
          auVar144._8_4_ = uVar124;
          auVar144._12_4_ = uVar124;
          auVar62 = vfmadd213ps_fma(auVar55,auVar144,auVar57);
          auVar70 = vfmadd213ps_avx512vl(auVar67,auVar144,auVar26);
          auVar69 = vfmadd213ps_fma(local_470,auVar144,auVar63);
          auVar60 = vsubps_avx(auVar70,auVar62);
          auVar62 = vfmadd213ps_fma(auVar60,auVar144,auVar62);
          auVar60 = vsubps_avx(auVar69,auVar70);
          auVar60 = vfmadd213ps_fma(auVar60,auVar144,auVar70);
          auVar60 = vsubps_avx(auVar60,auVar62);
          auVar62 = vfmadd231ps_fma(auVar62,auVar60,auVar144);
          auVar77 = vmulps_avx512vl(auVar60,auVar261);
          auVar236._8_8_ = auVar62._0_8_;
          auVar236._0_8_ = auVar62._0_8_;
          auVar60 = vshufpd_avx(auVar62,auVar62,3);
          auVar62 = vshufps_avx(auVar72,auVar72,0x55);
          auVar69 = vsubps_avx(auVar60,auVar236);
          auVar70 = vfmadd231ps_fma(auVar236,auVar62,auVar69);
          auVar257._8_8_ = auVar77._0_8_;
          auVar257._0_8_ = auVar77._0_8_;
          auVar60 = vshufpd_avx(auVar77,auVar77,3);
          auVar60 = vsubps_avx(auVar60,auVar257);
          auVar62 = vfmadd213ps_fma(auVar60,auVar62,auVar257);
          auVar145._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
          auVar145._8_4_ = auVar69._8_4_ ^ 0x80000000;
          auVar145._12_4_ = auVar69._12_4_ ^ 0x80000000;
          auVar60 = vmovshdup_avx(auVar62);
          auVar258._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
          auVar258._8_4_ = auVar60._8_4_ ^ 0x80000000;
          auVar258._12_4_ = auVar60._12_4_ ^ 0x80000000;
          auVar77 = vmovshdup_avx512vl(auVar69);
          auVar78 = vpermt2ps_avx512vl(auVar258,ZEXT416(5),auVar69);
          auVar60 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar60._0_4_ * auVar69._0_4_)),auVar62,
                                        auVar77);
          auVar62 = vpermt2ps_avx512vl(auVar62,SUB6416(ZEXT464(4),0),auVar145);
          auVar152._0_4_ = auVar60._0_4_;
          auVar152._4_4_ = auVar152._0_4_;
          auVar152._8_4_ = auVar152._0_4_;
          auVar152._12_4_ = auVar152._0_4_;
          auVar60 = vdivps_avx(auVar78,auVar152);
          auVar62 = vdivps_avx(auVar62,auVar152);
          fVar209 = auVar70._0_4_;
          auVar69 = vshufps_avx(auVar70,auVar70,0x55);
          fVar226 = auVar62._0_4_;
          auVar237._0_4_ = fVar209 * auVar60._0_4_ + auVar69._0_4_ * fVar226;
          auVar237._4_4_ = fVar209 * auVar60._4_4_ + auVar69._4_4_ * auVar62._4_4_;
          auVar237._8_4_ = fVar209 * auVar60._8_4_ + auVar69._8_4_ * auVar62._8_4_;
          auVar237._12_4_ = fVar209 * auVar60._12_4_ + auVar69._12_4_ * auVar62._12_4_;
          auVar73 = vsubps_avx(auVar68,auVar237);
          auVar70 = vmovshdup_avx(auVar60);
          auVar68 = vinsertps_avx(auVar196,auVar216,0x1c);
          auVar259._0_4_ = auVar70._0_4_ * auVar68._0_4_;
          auVar259._4_4_ = auVar70._4_4_ * auVar68._4_4_;
          auVar259._8_4_ = auVar70._8_4_ * auVar68._8_4_;
          auVar259._12_4_ = auVar70._12_4_ * auVar68._12_4_;
          auVar69 = vinsertps_avx(auVar182,auVar228,0x1c);
          auVar238._0_4_ = auVar70._0_4_ * auVar69._0_4_;
          auVar238._4_4_ = auVar70._4_4_ * auVar69._4_4_;
          auVar238._8_4_ = auVar70._8_4_ * auVar69._8_4_;
          auVar238._12_4_ = auVar70._12_4_ * auVar69._12_4_;
          auVar71 = vminps_avx512vl(auVar259,auVar238);
          auVar78 = vmaxps_avx(auVar238,auVar259);
          auVar76 = vmovshdup_avx(auVar62);
          auVar70 = vinsertps_avx(auVar216,auVar196,0x4c);
          auVar217._0_4_ = auVar76._0_4_ * auVar70._0_4_;
          auVar217._4_4_ = auVar76._4_4_ * auVar70._4_4_;
          auVar217._8_4_ = auVar76._8_4_ * auVar70._8_4_;
          auVar217._12_4_ = auVar76._12_4_ * auVar70._12_4_;
          auVar77 = vinsertps_avx(auVar228,auVar182,0x4c);
          auVar229._0_4_ = auVar76._0_4_ * auVar77._0_4_;
          auVar229._4_4_ = auVar76._4_4_ * auVar77._4_4_;
          auVar229._8_4_ = auVar76._8_4_ * auVar77._8_4_;
          auVar229._12_4_ = auVar76._12_4_ * auVar77._12_4_;
          auVar76 = vminps_avx(auVar217,auVar229);
          auVar71 = vaddps_avx512vl(auVar71,auVar76);
          auVar76 = vmaxps_avx(auVar229,auVar217);
          auVar218._0_4_ = auVar78._0_4_ + auVar76._0_4_;
          auVar218._4_4_ = auVar78._4_4_ + auVar76._4_4_;
          auVar218._8_4_ = auVar78._8_4_ + auVar76._8_4_;
          auVar218._12_4_ = auVar78._12_4_ + auVar76._12_4_;
          auVar230._8_8_ = 0x3f80000000000000;
          auVar230._0_8_ = 0x3f80000000000000;
          auVar78 = vsubps_avx(auVar230,auVar218);
          auVar76 = vsubps_avx(auVar230,auVar71);
          auVar71 = vsubps_avx(auVar81,auVar72);
          auVar72 = vsubps_avx(auVar80,auVar72);
          fVar224 = auVar71._0_4_;
          auVar260._0_4_ = fVar224 * auVar78._0_4_;
          fVar225 = auVar71._4_4_;
          auVar260._4_4_ = fVar225 * auVar78._4_4_;
          fVar244 = auVar71._8_4_;
          auVar260._8_4_ = fVar244 * auVar78._8_4_;
          fVar245 = auVar71._12_4_;
          auVar260._12_4_ = fVar245 * auVar78._12_4_;
          auVar79 = vbroadcastss_avx512vl(auVar60);
          auVar68 = vmulps_avx512vl(auVar79,auVar68);
          auVar69 = vmulps_avx512vl(auVar79,auVar69);
          auVar79 = vminps_avx512vl(auVar68,auVar69);
          auVar68 = vmaxps_avx(auVar69,auVar68);
          auVar197._0_4_ = fVar226 * auVar70._0_4_;
          auVar197._4_4_ = fVar226 * auVar70._4_4_;
          auVar197._8_4_ = fVar226 * auVar70._8_4_;
          auVar197._12_4_ = fVar226 * auVar70._12_4_;
          auVar183._0_4_ = fVar226 * auVar77._0_4_;
          auVar183._4_4_ = fVar226 * auVar77._4_4_;
          auVar183._8_4_ = fVar226 * auVar77._8_4_;
          auVar183._12_4_ = fVar226 * auVar77._12_4_;
          auVar69 = vminps_avx(auVar197,auVar183);
          auVar70 = vaddps_avx512vl(auVar79,auVar69);
          auVar77 = vmulps_avx512vl(auVar71,auVar76);
          fVar209 = auVar72._0_4_;
          auVar219._0_4_ = fVar209 * auVar78._0_4_;
          fVar221 = auVar72._4_4_;
          auVar219._4_4_ = fVar221 * auVar78._4_4_;
          fVar222 = auVar72._8_4_;
          auVar219._8_4_ = fVar222 * auVar78._8_4_;
          fVar223 = auVar72._12_4_;
          auVar219._12_4_ = fVar223 * auVar78._12_4_;
          auVar231._0_4_ = fVar209 * auVar76._0_4_;
          auVar231._4_4_ = fVar221 * auVar76._4_4_;
          auVar231._8_4_ = fVar222 * auVar76._8_4_;
          auVar231._12_4_ = fVar223 * auVar76._12_4_;
          auVar69 = vmaxps_avx(auVar183,auVar197);
          auVar184._0_4_ = auVar68._0_4_ + auVar69._0_4_;
          auVar184._4_4_ = auVar68._4_4_ + auVar69._4_4_;
          auVar184._8_4_ = auVar68._8_4_ + auVar69._8_4_;
          auVar184._12_4_ = auVar68._12_4_ + auVar69._12_4_;
          auVar198._8_8_ = 0x3f800000;
          auVar198._0_8_ = 0x3f800000;
          auVar68 = vsubps_avx(auVar198,auVar184);
          auVar69 = vsubps_avx(auVar198,auVar70);
          auVar251._0_4_ = fVar224 * auVar68._0_4_;
          auVar251._4_4_ = fVar225 * auVar68._4_4_;
          auVar251._8_4_ = fVar244 * auVar68._8_4_;
          auVar251._12_4_ = fVar245 * auVar68._12_4_;
          auVar239._0_4_ = fVar224 * auVar69._0_4_;
          auVar239._4_4_ = fVar225 * auVar69._4_4_;
          auVar239._8_4_ = fVar244 * auVar69._8_4_;
          auVar239._12_4_ = fVar245 * auVar69._12_4_;
          auVar185._0_4_ = fVar209 * auVar68._0_4_;
          auVar185._4_4_ = fVar221 * auVar68._4_4_;
          auVar185._8_4_ = fVar222 * auVar68._8_4_;
          auVar185._12_4_ = fVar223 * auVar68._12_4_;
          auVar199._0_4_ = fVar209 * auVar69._0_4_;
          auVar199._4_4_ = fVar221 * auVar69._4_4_;
          auVar199._8_4_ = fVar222 * auVar69._8_4_;
          auVar199._12_4_ = fVar223 * auVar69._12_4_;
          auVar68 = vminps_avx(auVar251,auVar239);
          auVar69 = vminps_avx(auVar185,auVar199);
          auVar70 = vminps_avx(auVar68,auVar69);
          auVar68 = vmaxps_avx(auVar239,auVar251);
          auVar69 = vmaxps_avx(auVar199,auVar185);
          auVar69 = vmaxps_avx(auVar69,auVar68);
          auVar78 = vminps_avx512vl(auVar260,auVar77);
          auVar68 = vminps_avx(auVar219,auVar231);
          auVar68 = vminps_avx(auVar78,auVar68);
          auVar68 = vhaddps_avx(auVar70,auVar68);
          auVar77 = vmaxps_avx512vl(auVar77,auVar260);
          auVar70 = vmaxps_avx(auVar231,auVar219);
          auVar70 = vmaxps_avx(auVar70,auVar77);
          auVar69 = vhaddps_avx(auVar69,auVar70);
          auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
          auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
          auVar186._0_4_ = auVar68._0_4_ + auVar73._0_4_;
          auVar186._4_4_ = auVar68._4_4_ + auVar73._4_4_;
          auVar186._8_4_ = auVar68._8_4_ + auVar73._8_4_;
          auVar186._12_4_ = auVar68._12_4_ + auVar73._12_4_;
          auVar200._0_4_ = auVar69._0_4_ + auVar73._0_4_;
          auVar200._4_4_ = auVar69._4_4_ + auVar73._4_4_;
          auVar200._8_4_ = auVar69._8_4_ + auVar73._8_4_;
          auVar200._12_4_ = auVar69._12_4_ + auVar73._12_4_;
          auVar68 = vmaxps_avx(auVar81,auVar186);
          auVar69 = vminps_avx(auVar200,auVar80);
          uVar51 = vcmpps_avx512vl(auVar69,auVar68,1);
          auVar68 = vinsertps_avx(auVar74,auVar75,0x10);
          auVar252 = ZEXT1664(auVar68);
          auVar69 = ZEXT416(5);
          if ((uVar51 & 3) == 0) {
            vucomiss_avx512f(auVar59);
            auVar69 = vxorps_avx512vl(auVar69,auVar69);
            auVar267 = ZEXT1664(auVar69);
            if ((uint)uVar47 < 4 && (uVar5 == 0 || lVar52 == 0)) {
              bVar10 = false;
            }
            else {
              lVar52 = 200;
              do {
                auVar80 = vsubss_avx512f(auVar61,auVar73);
                fVar222 = auVar80._0_4_;
                fVar209 = fVar222 * fVar222 * fVar222;
                fVar223 = auVar73._0_4_;
                fVar221 = fVar223 * 3.0 * fVar222 * fVar222;
                fVar222 = fVar222 * fVar223 * fVar223 * 3.0;
                auVar166._4_4_ = fVar209;
                auVar166._0_4_ = fVar209;
                auVar166._8_4_ = fVar209;
                auVar166._12_4_ = fVar209;
                auVar158._4_4_ = fVar221;
                auVar158._0_4_ = fVar221;
                auVar158._8_4_ = fVar221;
                auVar158._12_4_ = fVar221;
                auVar131._4_4_ = fVar222;
                auVar131._0_4_ = fVar222;
                auVar131._8_4_ = fVar222;
                auVar131._12_4_ = fVar222;
                fVar223 = fVar223 * fVar223 * fVar223;
                auVar175._0_4_ = (float)local_600._0_4_ * fVar223;
                auVar175._4_4_ = (float)local_600._4_4_ * fVar223;
                auVar175._8_4_ = fStack_5f8 * fVar223;
                auVar175._12_4_ = fStack_5f4 * fVar223;
                auVar80 = vfmadd231ps_fma(auVar175,auVar63,auVar131);
                auVar80 = vfmadd231ps_fma(auVar80,auVar26,auVar158);
                auVar80 = vfmadd231ps_fma(auVar80,auVar57,auVar166);
                auVar132._8_8_ = auVar80._0_8_;
                auVar132._0_8_ = auVar80._0_8_;
                auVar80 = vshufpd_avx(auVar80,auVar80,3);
                auVar70 = vshufps_avx(auVar73,auVar73,0x55);
                auVar80 = vsubps_avx(auVar80,auVar132);
                auVar70 = vfmadd213ps_fma(auVar80,auVar70,auVar132);
                fVar209 = auVar70._0_4_;
                auVar80 = vshufps_avx(auVar70,auVar70,0x55);
                auVar133._0_4_ = auVar60._0_4_ * fVar209 + fVar226 * auVar80._0_4_;
                auVar133._4_4_ = auVar60._4_4_ * fVar209 + auVar62._4_4_ * auVar80._4_4_;
                auVar133._8_4_ = auVar60._8_4_ * fVar209 + auVar62._8_4_ * auVar80._8_4_;
                auVar133._12_4_ = auVar60._12_4_ * fVar209 + auVar62._12_4_ * auVar80._12_4_;
                auVar73 = vsubps_avx(auVar73,auVar133);
                auVar80 = vandps_avx512vl(auVar70,auVar264._0_16_);
                auVar70 = vprolq_avx512vl(auVar80,0x20);
                auVar80 = vmaxss_avx(auVar70,auVar80);
                bVar25 = auVar80._0_4_ <= (float)local_610._0_4_;
                if (auVar80._0_4_ < (float)local_610._0_4_) {
                  auVar60 = vucomiss_avx512f(auVar69);
                  if (bVar25) {
                    auVar61 = vucomiss_avx512f(auVar60);
                    auVar263 = ZEXT1664(auVar61);
                    auVar252 = ZEXT1664(auVar68);
                    if (bVar25) {
                      vmovshdup_avx(auVar60);
                      auVar61 = vucomiss_avx512f(auVar69);
                      if (bVar25) {
                        auVar62 = vucomiss_avx512f(auVar61);
                        auVar263 = ZEXT1664(auVar62);
                        if (bVar25) {
                          auVar80 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar73 = vinsertps_avx(auVar80,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar80 = vdpps_avx(auVar73,local_480,0x7f);
                          auVar70 = vdpps_avx(auVar73,local_490,0x7f);
                          auVar77 = vdpps_avx(auVar73,local_4a0,0x7f);
                          auVar78 = vdpps_avx(auVar73,local_4b0,0x7f);
                          auVar76 = vdpps_avx(auVar73,local_4c0,0x7f);
                          auVar71 = vdpps_avx(auVar73,local_4d0,0x7f);
                          auVar72 = vdpps_avx(auVar73,local_4e0,0x7f);
                          auVar73 = vdpps_avx(auVar73,local_4f0,0x7f);
                          auVar81 = vsubss_avx512f(auVar62,auVar61);
                          fVar223 = auVar61._0_4_;
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar76._0_4_)),auVar81
                                                    ,auVar80);
                          auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar223)),auVar81
                                                    ,auVar70);
                          auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * fVar223)),auVar81
                                                    ,auVar77);
                          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar73._0_4_)),auVar81
                                                    ,auVar78);
                          auVar62 = vsubss_avx512f(auVar62,auVar60);
                          auVar187._0_4_ = auVar62._0_4_;
                          fVar226 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
                          fVar222 = auVar60._0_4_;
                          fVar209 = fVar222 * 3.0 * auVar187._0_4_ * auVar187._0_4_;
                          fVar221 = auVar187._0_4_ * fVar222 * fVar222 * 3.0;
                          fVar225 = fVar222 * fVar222 * fVar222;
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar77._0_4_)),
                                                    ZEXT416((uint)fVar221),auVar70);
                          auVar62 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar209),auVar80);
                          auVar61 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar226),auVar61);
                          fVar224 = auVar61._0_4_;
                          if ((fVar120 <= fVar224) &&
                             (fVar244 = *(float *)(ray + k * 4 + 0x200), fVar224 <= fVar244)) {
                            auVar61 = vshufps_avx(auVar60,auVar60,0x55);
                            auVar70 = vsubps_avx512vl(auVar246,auVar61);
                            fVar245 = auVar61._0_4_;
                            auVar220._0_4_ = fVar245 * (float)local_510._0_4_;
                            fVar253 = auVar61._4_4_;
                            auVar220._4_4_ = fVar253 * (float)local_510._4_4_;
                            fVar254 = auVar61._8_4_;
                            auVar220._8_4_ = fVar254 * fStack_508;
                            fVar255 = auVar61._12_4_;
                            auVar220._12_4_ = fVar255 * fStack_504;
                            auVar232._0_4_ = fVar245 * (float)local_560._0_4_;
                            auVar232._4_4_ = fVar253 * (float)local_560._4_4_;
                            auVar232._8_4_ = fVar254 * fStack_558;
                            auVar232._12_4_ = fVar255 * fStack_554;
                            auVar240._0_4_ = fVar245 * (float)local_570._0_4_;
                            auVar240._4_4_ = fVar253 * (float)local_570._4_4_;
                            auVar240._8_4_ = fVar254 * fStack_568;
                            auVar240._12_4_ = fVar255 * fStack_564;
                            auVar201._0_4_ = fVar245 * (float)local_530._0_4_;
                            auVar201._4_4_ = fVar253 * (float)local_530._4_4_;
                            auVar201._8_4_ = fVar254 * fStack_528;
                            auVar201._12_4_ = fVar255 * fStack_524;
                            auVar61 = vfmadd231ps_fma(auVar220,auVar70,local_500);
                            auVar62 = vfmadd231ps_fma(auVar232,auVar70,local_540);
                            auVar80 = vfmadd231ps_fma(auVar240,auVar70,local_550);
                            auVar70 = vfmadd231ps_fma(auVar201,auVar70,local_520);
                            auVar61 = vsubps_avx(auVar62,auVar61);
                            auVar62 = vsubps_avx(auVar80,auVar62);
                            auVar80 = vsubps_avx(auVar70,auVar80);
                            auVar241._0_4_ = fVar222 * auVar62._0_4_;
                            auVar241._4_4_ = fVar222 * auVar62._4_4_;
                            auVar241._8_4_ = fVar222 * auVar62._8_4_;
                            auVar241._12_4_ = fVar222 * auVar62._12_4_;
                            auVar187._4_4_ = auVar187._0_4_;
                            auVar187._8_4_ = auVar187._0_4_;
                            auVar187._12_4_ = auVar187._0_4_;
                            auVar61 = vfmadd231ps_fma(auVar241,auVar187,auVar61);
                            auVar202._0_4_ = fVar222 * auVar80._0_4_;
                            auVar202._4_4_ = fVar222 * auVar80._4_4_;
                            auVar202._8_4_ = fVar222 * auVar80._8_4_;
                            auVar202._12_4_ = fVar222 * auVar80._12_4_;
                            auVar62 = vfmadd231ps_fma(auVar202,auVar187,auVar62);
                            auVar203._0_4_ = fVar222 * auVar62._0_4_;
                            auVar203._4_4_ = fVar222 * auVar62._4_4_;
                            auVar203._8_4_ = fVar222 * auVar62._8_4_;
                            auVar203._12_4_ = fVar222 * auVar62._12_4_;
                            auVar61 = vfmadd231ps_fma(auVar203,auVar187,auVar61);
                            auVar61 = vmulps_avx512vl(auVar61,auVar261);
                            pGVar6 = (context->scene->geometries).items[uVar53].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                              auVar176._0_4_ = fVar225 * (float)local_5b0._0_4_;
                              auVar176._4_4_ = fVar225 * (float)local_5b0._4_4_;
                              auVar176._8_4_ = fVar225 * fStack_5a8;
                              auVar176._12_4_ = fVar225 * fStack_5a4;
                              auVar167._4_4_ = fVar221;
                              auVar167._0_4_ = fVar221;
                              auVar167._8_4_ = fVar221;
                              auVar167._12_4_ = fVar221;
                              auVar62 = vfmadd132ps_fma(auVar167,auVar176,local_5a0);
                              auVar159._4_4_ = fVar209;
                              auVar159._0_4_ = fVar209;
                              auVar159._8_4_ = fVar209;
                              auVar159._12_4_ = fVar209;
                              auVar62 = vfmadd132ps_fma(auVar159,auVar62,local_590);
                              auVar153._4_4_ = fVar226;
                              auVar153._0_4_ = fVar226;
                              auVar153._8_4_ = fVar226;
                              auVar153._12_4_ = fVar226;
                              auVar70 = vfmadd132ps_fma(auVar153,auVar62,local_580);
                              auVar62 = vshufps_avx(auVar70,auVar70,0xc9);
                              auVar80 = vshufps_avx(auVar61,auVar61,0xc9);
                              auVar154._0_4_ = auVar70._0_4_ * auVar80._0_4_;
                              auVar154._4_4_ = auVar70._4_4_ * auVar80._4_4_;
                              auVar154._8_4_ = auVar70._8_4_ * auVar80._8_4_;
                              auVar154._12_4_ = auVar70._12_4_ * auVar80._12_4_;
                              auVar61 = vfmsub231ps_fma(auVar154,auVar61,auVar62);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x200) = fVar224;
                                uVar124 = vextractps_avx(auVar61,1);
                                *(undefined4 *)(ray + k * 4 + 0x300) = uVar124;
                                uVar124 = vextractps_avx(auVar61,2);
                                *(undefined4 *)(ray + k * 4 + 0x340) = uVar124;
                                *(int *)(ray + k * 4 + 0x380) = auVar61._0_4_;
                                *(float *)(ray + k * 4 + 0x3c0) = fVar222;
                                *(float *)(ray + k * 4 + 0x400) = fVar223;
                                *(uint *)(ray + k * 4 + 0x440) = uVar4;
                                *(uint *)(ray + k * 4 + 0x480) = uVar53;
                                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                              }
                              else {
                                local_200 = vbroadcastss_avx512f(auVar60);
                                auVar104 = vbroadcastss_avx512f(ZEXT416(1));
                                local_1c0 = vpermps_avx512f(auVar104,ZEXT1664(auVar60));
                                auVar104 = vpermps_avx512f(auVar104,ZEXT1664(auVar61));
                                auVar265 = vbroadcastss_avx512f(ZEXT416(2));
                                local_280 = vpermps_avx512f(auVar265,ZEXT1664(auVar61));
                                local_240 = vbroadcastss_avx512f(auVar61);
                                local_2c0[0] = (RTCHitN)auVar104[0];
                                local_2c0[1] = (RTCHitN)auVar104[1];
                                local_2c0[2] = (RTCHitN)auVar104[2];
                                local_2c0[3] = (RTCHitN)auVar104[3];
                                local_2c0[4] = (RTCHitN)auVar104[4];
                                local_2c0[5] = (RTCHitN)auVar104[5];
                                local_2c0[6] = (RTCHitN)auVar104[6];
                                local_2c0[7] = (RTCHitN)auVar104[7];
                                local_2c0[8] = (RTCHitN)auVar104[8];
                                local_2c0[9] = (RTCHitN)auVar104[9];
                                local_2c0[10] = (RTCHitN)auVar104[10];
                                local_2c0[0xb] = (RTCHitN)auVar104[0xb];
                                local_2c0[0xc] = (RTCHitN)auVar104[0xc];
                                local_2c0[0xd] = (RTCHitN)auVar104[0xd];
                                local_2c0[0xe] = (RTCHitN)auVar104[0xe];
                                local_2c0[0xf] = (RTCHitN)auVar104[0xf];
                                local_2c0[0x10] = (RTCHitN)auVar104[0x10];
                                local_2c0[0x11] = (RTCHitN)auVar104[0x11];
                                local_2c0[0x12] = (RTCHitN)auVar104[0x12];
                                local_2c0[0x13] = (RTCHitN)auVar104[0x13];
                                local_2c0[0x14] = (RTCHitN)auVar104[0x14];
                                local_2c0[0x15] = (RTCHitN)auVar104[0x15];
                                local_2c0[0x16] = (RTCHitN)auVar104[0x16];
                                local_2c0[0x17] = (RTCHitN)auVar104[0x17];
                                local_2c0[0x18] = (RTCHitN)auVar104[0x18];
                                local_2c0[0x19] = (RTCHitN)auVar104[0x19];
                                local_2c0[0x1a] = (RTCHitN)auVar104[0x1a];
                                local_2c0[0x1b] = (RTCHitN)auVar104[0x1b];
                                local_2c0[0x1c] = (RTCHitN)auVar104[0x1c];
                                local_2c0[0x1d] = (RTCHitN)auVar104[0x1d];
                                local_2c0[0x1e] = (RTCHitN)auVar104[0x1e];
                                local_2c0[0x1f] = (RTCHitN)auVar104[0x1f];
                                local_2c0[0x20] = (RTCHitN)auVar104[0x20];
                                local_2c0[0x21] = (RTCHitN)auVar104[0x21];
                                local_2c0[0x22] = (RTCHitN)auVar104[0x22];
                                local_2c0[0x23] = (RTCHitN)auVar104[0x23];
                                local_2c0[0x24] = (RTCHitN)auVar104[0x24];
                                local_2c0[0x25] = (RTCHitN)auVar104[0x25];
                                local_2c0[0x26] = (RTCHitN)auVar104[0x26];
                                local_2c0[0x27] = (RTCHitN)auVar104[0x27];
                                local_2c0[0x28] = (RTCHitN)auVar104[0x28];
                                local_2c0[0x29] = (RTCHitN)auVar104[0x29];
                                local_2c0[0x2a] = (RTCHitN)auVar104[0x2a];
                                local_2c0[0x2b] = (RTCHitN)auVar104[0x2b];
                                local_2c0[0x2c] = (RTCHitN)auVar104[0x2c];
                                local_2c0[0x2d] = (RTCHitN)auVar104[0x2d];
                                local_2c0[0x2e] = (RTCHitN)auVar104[0x2e];
                                local_2c0[0x2f] = (RTCHitN)auVar104[0x2f];
                                local_2c0[0x30] = (RTCHitN)auVar104[0x30];
                                local_2c0[0x31] = (RTCHitN)auVar104[0x31];
                                local_2c0[0x32] = (RTCHitN)auVar104[0x32];
                                local_2c0[0x33] = (RTCHitN)auVar104[0x33];
                                local_2c0[0x34] = (RTCHitN)auVar104[0x34];
                                local_2c0[0x35] = (RTCHitN)auVar104[0x35];
                                local_2c0[0x36] = (RTCHitN)auVar104[0x36];
                                local_2c0[0x37] = (RTCHitN)auVar104[0x37];
                                local_2c0[0x38] = (RTCHitN)auVar104[0x38];
                                local_2c0[0x39] = (RTCHitN)auVar104[0x39];
                                local_2c0[0x3a] = (RTCHitN)auVar104[0x3a];
                                local_2c0[0x3b] = (RTCHitN)auVar104[0x3b];
                                local_2c0[0x3c] = (RTCHitN)auVar104[0x3c];
                                local_2c0[0x3d] = (RTCHitN)auVar104[0x3d];
                                local_2c0[0x3e] = (RTCHitN)auVar104[0x3e];
                                local_2c0[0x3f] = (RTCHitN)auVar104[0x3f];
                                local_180 = local_340._0_8_;
                                uStack_178 = local_340._8_8_;
                                uStack_170 = local_340._16_8_;
                                uStack_168 = local_340._24_8_;
                                uStack_160 = local_340._32_8_;
                                uStack_158 = local_340._40_8_;
                                uStack_150 = local_340._48_8_;
                                uStack_148 = local_340._56_8_;
                                auVar104 = vmovdqa64_avx512f(local_300);
                                local_140 = vmovdqa64_avx512f(auVar104);
                                vpcmpeqd_avx2(auVar104._0_32_,auVar104._0_32_);
                                local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                                local_c0 = vbroadcastss_avx512f
                                                     (ZEXT416(context->user->instPrimID[0]));
                                *(float *)(ray + k * 4 + 0x200) = fVar224;
                                local_440 = local_380;
                                local_640.valid = (int *)local_440;
                                local_640.geometryUserPtr = pGVar6->userPtr;
                                local_640.context = context->user;
                                local_640.hit = local_2c0;
                                local_640.N = 0x10;
                                local_640.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_640);
                                  auVar60 = vxorps_avx512vl(auVar69,auVar69);
                                  auVar267 = ZEXT1664(auVar60);
                                  auVar263 = ZEXT464(0x3f800000);
                                  auVar106._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM19 = ZEXT3264(auVar106._32_32_);
                                  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar262 = ZEXT1664(auVar60);
                                  auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar264 = ZEXT1664(auVar60);
                                }
                                auVar60 = auVar267._0_16_;
                                auVar104 = vmovdqa64_avx512f(local_440);
                                uVar27 = vptestmd_avx512f(auVar104,auVar104);
                                if ((short)uVar27 == 0) {
LAB_01b44f12:
                                  *(float *)(ray + k * 4 + 0x200) = fVar244;
                                }
                                else {
                                  p_Var9 = context->args->filter;
                                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var9)(&local_640);
                                    auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                    auVar267 = ZEXT1664(auVar60);
                                    auVar263 = ZEXT464(0x3f800000);
                                    auVar106._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    in_ZMM19 = ZEXT3264(auVar106._32_32_);
                                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar262 = ZEXT1664(auVar60);
                                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar264 = ZEXT1664(auVar60);
                                  }
                                  auVar104 = vmovdqa64_avx512f(local_440);
                                  uVar51 = vptestmd_avx512f(auVar104,auVar104);
                                  if ((short)uVar51 == 0) goto LAB_01b44f12;
                                  iVar119 = *(int *)(local_640.hit + 4);
                                  iVar266 = *(int *)(local_640.hit + 8);
                                  iVar32 = *(int *)(local_640.hit + 0xc);
                                  iVar33 = *(int *)(local_640.hit + 0x10);
                                  iVar34 = *(int *)(local_640.hit + 0x14);
                                  iVar35 = *(int *)(local_640.hit + 0x18);
                                  iVar36 = *(int *)(local_640.hit + 0x1c);
                                  iVar37 = *(int *)(local_640.hit + 0x20);
                                  iVar38 = *(int *)(local_640.hit + 0x24);
                                  iVar39 = *(int *)(local_640.hit + 0x28);
                                  iVar40 = *(int *)(local_640.hit + 0x2c);
                                  iVar41 = *(int *)(local_640.hit + 0x30);
                                  iVar42 = *(int *)(local_640.hit + 0x34);
                                  iVar43 = *(int *)(local_640.hit + 0x38);
                                  iVar44 = *(int *)(local_640.hit + 0x3c);
                                  bVar45 = (byte)uVar51;
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar51 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar51 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar51 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar51 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar51 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar51 >> 7) & 1);
                                  bVar17 = (byte)(uVar51 >> 8);
                                  bVar18 = (bool)((byte)(uVar51 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar51 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar51 >> 0xf,0);
                                  *(uint *)(local_640.ray + 0x300) =
                                       (uint)(bVar45 & 1) * *(int *)local_640.hit |
                                       (uint)!(bool)(bVar45 & 1) * *(int *)(local_640.ray + 0x300);
                                  *(uint *)(local_640.ray + 0x304) =
                                       (uint)bVar25 * iVar119 |
                                       (uint)!bVar25 * *(int *)(local_640.ray + 0x304);
                                  *(uint *)(local_640.ray + 0x308) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_640.ray + 0x308);
                                  *(uint *)(local_640.ray + 0x30c) =
                                       (uint)bVar12 * iVar32 |
                                       (uint)!bVar12 * *(int *)(local_640.ray + 0x30c);
                                  *(uint *)(local_640.ray + 0x310) =
                                       (uint)bVar13 * iVar33 |
                                       (uint)!bVar13 * *(int *)(local_640.ray + 0x310);
                                  *(uint *)(local_640.ray + 0x314) =
                                       (uint)bVar14 * iVar34 |
                                       (uint)!bVar14 * *(int *)(local_640.ray + 0x314);
                                  *(uint *)(local_640.ray + 0x318) =
                                       (uint)bVar15 * iVar35 |
                                       (uint)!bVar15 * *(int *)(local_640.ray + 0x318);
                                  *(uint *)(local_640.ray + 0x31c) =
                                       (uint)bVar16 * iVar36 |
                                       (uint)!bVar16 * *(int *)(local_640.ray + 0x31c);
                                  *(uint *)(local_640.ray + 800) =
                                       (uint)(bVar17 & 1) * iVar37 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_640.ray + 800);
                                  *(uint *)(local_640.ray + 0x324) =
                                       (uint)bVar18 * iVar38 |
                                       (uint)!bVar18 * *(int *)(local_640.ray + 0x324);
                                  *(uint *)(local_640.ray + 0x328) =
                                       (uint)bVar19 * iVar39 |
                                       (uint)!bVar19 * *(int *)(local_640.ray + 0x328);
                                  *(uint *)(local_640.ray + 0x32c) =
                                       (uint)bVar20 * iVar40 |
                                       (uint)!bVar20 * *(int *)(local_640.ray + 0x32c);
                                  *(uint *)(local_640.ray + 0x330) =
                                       (uint)bVar21 * iVar41 |
                                       (uint)!bVar21 * *(int *)(local_640.ray + 0x330);
                                  *(uint *)(local_640.ray + 0x334) =
                                       (uint)bVar22 * iVar42 |
                                       (uint)!bVar22 * *(int *)(local_640.ray + 0x334);
                                  *(uint *)(local_640.ray + 0x338) =
                                       (uint)bVar23 * iVar43 |
                                       (uint)!bVar23 * *(int *)(local_640.ray + 0x338);
                                  *(uint *)(local_640.ray + 0x33c) =
                                       (uint)bVar24 * iVar44 |
                                       (uint)!bVar24 * *(int *)(local_640.ray + 0x33c);
                                  iVar119 = *(int *)(local_640.hit + 0x44);
                                  iVar266 = *(int *)(local_640.hit + 0x48);
                                  iVar32 = *(int *)(local_640.hit + 0x4c);
                                  iVar33 = *(int *)(local_640.hit + 0x50);
                                  iVar34 = *(int *)(local_640.hit + 0x54);
                                  iVar35 = *(int *)(local_640.hit + 0x58);
                                  iVar36 = *(int *)(local_640.hit + 0x5c);
                                  iVar37 = *(int *)(local_640.hit + 0x60);
                                  iVar38 = *(int *)(local_640.hit + 100);
                                  iVar39 = *(int *)(local_640.hit + 0x68);
                                  iVar40 = *(int *)(local_640.hit + 0x6c);
                                  iVar41 = *(int *)(local_640.hit + 0x70);
                                  iVar42 = *(int *)(local_640.hit + 0x74);
                                  iVar43 = *(int *)(local_640.hit + 0x78);
                                  iVar44 = *(int *)(local_640.hit + 0x7c);
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar51 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar51 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar51 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar51 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar51 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar51 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar51 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar51 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar51 >> 0xf,0);
                                  *(uint *)(local_640.ray + 0x340) =
                                       (uint)(bVar45 & 1) * *(int *)(local_640.hit + 0x40) |
                                       (uint)!(bool)(bVar45 & 1) * *(int *)(local_640.ray + 0x340);
                                  *(uint *)(local_640.ray + 0x344) =
                                       (uint)bVar25 * iVar119 |
                                       (uint)!bVar25 * *(int *)(local_640.ray + 0x344);
                                  *(uint *)(local_640.ray + 0x348) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_640.ray + 0x348);
                                  *(uint *)(local_640.ray + 0x34c) =
                                       (uint)bVar12 * iVar32 |
                                       (uint)!bVar12 * *(int *)(local_640.ray + 0x34c);
                                  *(uint *)(local_640.ray + 0x350) =
                                       (uint)bVar13 * iVar33 |
                                       (uint)!bVar13 * *(int *)(local_640.ray + 0x350);
                                  *(uint *)(local_640.ray + 0x354) =
                                       (uint)bVar14 * iVar34 |
                                       (uint)!bVar14 * *(int *)(local_640.ray + 0x354);
                                  *(uint *)(local_640.ray + 0x358) =
                                       (uint)bVar15 * iVar35 |
                                       (uint)!bVar15 * *(int *)(local_640.ray + 0x358);
                                  *(uint *)(local_640.ray + 0x35c) =
                                       (uint)bVar16 * iVar36 |
                                       (uint)!bVar16 * *(int *)(local_640.ray + 0x35c);
                                  *(uint *)(local_640.ray + 0x360) =
                                       (uint)(bVar17 & 1) * iVar37 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_640.ray + 0x360);
                                  *(uint *)(local_640.ray + 0x364) =
                                       (uint)bVar18 * iVar38 |
                                       (uint)!bVar18 * *(int *)(local_640.ray + 0x364);
                                  *(uint *)(local_640.ray + 0x368) =
                                       (uint)bVar19 * iVar39 |
                                       (uint)!bVar19 * *(int *)(local_640.ray + 0x368);
                                  *(uint *)(local_640.ray + 0x36c) =
                                       (uint)bVar20 * iVar40 |
                                       (uint)!bVar20 * *(int *)(local_640.ray + 0x36c);
                                  *(uint *)(local_640.ray + 0x370) =
                                       (uint)bVar21 * iVar41 |
                                       (uint)!bVar21 * *(int *)(local_640.ray + 0x370);
                                  *(uint *)(local_640.ray + 0x374) =
                                       (uint)bVar22 * iVar42 |
                                       (uint)!bVar22 * *(int *)(local_640.ray + 0x374);
                                  *(uint *)(local_640.ray + 0x378) =
                                       (uint)bVar23 * iVar43 |
                                       (uint)!bVar23 * *(int *)(local_640.ray + 0x378);
                                  *(uint *)(local_640.ray + 0x37c) =
                                       (uint)bVar24 * iVar44 |
                                       (uint)!bVar24 * *(int *)(local_640.ray + 0x37c);
                                  iVar119 = *(int *)(local_640.hit + 0x84);
                                  iVar266 = *(int *)(local_640.hit + 0x88);
                                  iVar32 = *(int *)(local_640.hit + 0x8c);
                                  iVar33 = *(int *)(local_640.hit + 0x90);
                                  iVar34 = *(int *)(local_640.hit + 0x94);
                                  iVar35 = *(int *)(local_640.hit + 0x98);
                                  iVar36 = *(int *)(local_640.hit + 0x9c);
                                  iVar37 = *(int *)(local_640.hit + 0xa0);
                                  iVar38 = *(int *)(local_640.hit + 0xa4);
                                  iVar39 = *(int *)(local_640.hit + 0xa8);
                                  iVar40 = *(int *)(local_640.hit + 0xac);
                                  iVar41 = *(int *)(local_640.hit + 0xb0);
                                  iVar42 = *(int *)(local_640.hit + 0xb4);
                                  iVar43 = *(int *)(local_640.hit + 0xb8);
                                  iVar44 = *(int *)(local_640.hit + 0xbc);
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar51 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar51 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar51 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar51 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar51 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar51 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar51 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar51 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar51 >> 0xf,0);
                                  *(uint *)(local_640.ray + 0x380) =
                                       (uint)(bVar45 & 1) * *(int *)(local_640.hit + 0x80) |
                                       (uint)!(bool)(bVar45 & 1) * *(int *)(local_640.ray + 0x380);
                                  *(uint *)(local_640.ray + 900) =
                                       (uint)bVar25 * iVar119 |
                                       (uint)!bVar25 * *(int *)(local_640.ray + 900);
                                  *(uint *)(local_640.ray + 0x388) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_640.ray + 0x388);
                                  *(uint *)(local_640.ray + 0x38c) =
                                       (uint)bVar12 * iVar32 |
                                       (uint)!bVar12 * *(int *)(local_640.ray + 0x38c);
                                  *(uint *)(local_640.ray + 0x390) =
                                       (uint)bVar13 * iVar33 |
                                       (uint)!bVar13 * *(int *)(local_640.ray + 0x390);
                                  *(uint *)(local_640.ray + 0x394) =
                                       (uint)bVar14 * iVar34 |
                                       (uint)!bVar14 * *(int *)(local_640.ray + 0x394);
                                  *(uint *)(local_640.ray + 0x398) =
                                       (uint)bVar15 * iVar35 |
                                       (uint)!bVar15 * *(int *)(local_640.ray + 0x398);
                                  *(uint *)(local_640.ray + 0x39c) =
                                       (uint)bVar16 * iVar36 |
                                       (uint)!bVar16 * *(int *)(local_640.ray + 0x39c);
                                  *(uint *)(local_640.ray + 0x3a0) =
                                       (uint)(bVar17 & 1) * iVar37 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_640.ray + 0x3a0);
                                  *(uint *)(local_640.ray + 0x3a4) =
                                       (uint)bVar18 * iVar38 |
                                       (uint)!bVar18 * *(int *)(local_640.ray + 0x3a4);
                                  *(uint *)(local_640.ray + 0x3a8) =
                                       (uint)bVar19 * iVar39 |
                                       (uint)!bVar19 * *(int *)(local_640.ray + 0x3a8);
                                  *(uint *)(local_640.ray + 0x3ac) =
                                       (uint)bVar20 * iVar40 |
                                       (uint)!bVar20 * *(int *)(local_640.ray + 0x3ac);
                                  *(uint *)(local_640.ray + 0x3b0) =
                                       (uint)bVar21 * iVar41 |
                                       (uint)!bVar21 * *(int *)(local_640.ray + 0x3b0);
                                  *(uint *)(local_640.ray + 0x3b4) =
                                       (uint)bVar22 * iVar42 |
                                       (uint)!bVar22 * *(int *)(local_640.ray + 0x3b4);
                                  *(uint *)(local_640.ray + 0x3b8) =
                                       (uint)bVar23 * iVar43 |
                                       (uint)!bVar23 * *(int *)(local_640.ray + 0x3b8);
                                  *(uint *)(local_640.ray + 0x3bc) =
                                       (uint)bVar24 * iVar44 |
                                       (uint)!bVar24 * *(int *)(local_640.ray + 0x3bc);
                                  iVar119 = *(int *)(local_640.hit + 0xc4);
                                  iVar266 = *(int *)(local_640.hit + 200);
                                  iVar32 = *(int *)(local_640.hit + 0xcc);
                                  iVar33 = *(int *)(local_640.hit + 0xd0);
                                  iVar34 = *(int *)(local_640.hit + 0xd4);
                                  iVar35 = *(int *)(local_640.hit + 0xd8);
                                  iVar36 = *(int *)(local_640.hit + 0xdc);
                                  iVar37 = *(int *)(local_640.hit + 0xe0);
                                  iVar38 = *(int *)(local_640.hit + 0xe4);
                                  iVar39 = *(int *)(local_640.hit + 0xe8);
                                  iVar40 = *(int *)(local_640.hit + 0xec);
                                  iVar41 = *(int *)(local_640.hit + 0xf0);
                                  iVar42 = *(int *)(local_640.hit + 0xf4);
                                  iVar43 = *(int *)(local_640.hit + 0xf8);
                                  iVar44 = *(int *)(local_640.hit + 0xfc);
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar51 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar51 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar51 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar51 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar51 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar51 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar51 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar51 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar51 >> 0xf,0);
                                  *(uint *)(local_640.ray + 0x3c0) =
                                       (uint)(bVar45 & 1) * *(int *)(local_640.hit + 0xc0) |
                                       (uint)!(bool)(bVar45 & 1) * *(int *)(local_640.ray + 0x3c0);
                                  *(uint *)(local_640.ray + 0x3c4) =
                                       (uint)bVar25 * iVar119 |
                                       (uint)!bVar25 * *(int *)(local_640.ray + 0x3c4);
                                  *(uint *)(local_640.ray + 0x3c8) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_640.ray + 0x3c8);
                                  *(uint *)(local_640.ray + 0x3cc) =
                                       (uint)bVar12 * iVar32 |
                                       (uint)!bVar12 * *(int *)(local_640.ray + 0x3cc);
                                  *(uint *)(local_640.ray + 0x3d0) =
                                       (uint)bVar13 * iVar33 |
                                       (uint)!bVar13 * *(int *)(local_640.ray + 0x3d0);
                                  *(uint *)(local_640.ray + 0x3d4) =
                                       (uint)bVar14 * iVar34 |
                                       (uint)!bVar14 * *(int *)(local_640.ray + 0x3d4);
                                  *(uint *)(local_640.ray + 0x3d8) =
                                       (uint)bVar15 * iVar35 |
                                       (uint)!bVar15 * *(int *)(local_640.ray + 0x3d8);
                                  *(uint *)(local_640.ray + 0x3dc) =
                                       (uint)bVar16 * iVar36 |
                                       (uint)!bVar16 * *(int *)(local_640.ray + 0x3dc);
                                  *(uint *)(local_640.ray + 0x3e0) =
                                       (uint)(bVar17 & 1) * iVar37 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_640.ray + 0x3e0);
                                  *(uint *)(local_640.ray + 0x3e4) =
                                       (uint)bVar18 * iVar38 |
                                       (uint)!bVar18 * *(int *)(local_640.ray + 0x3e4);
                                  *(uint *)(local_640.ray + 1000) =
                                       (uint)bVar19 * iVar39 |
                                       (uint)!bVar19 * *(int *)(local_640.ray + 1000);
                                  *(uint *)(local_640.ray + 0x3ec) =
                                       (uint)bVar20 * iVar40 |
                                       (uint)!bVar20 * *(int *)(local_640.ray + 0x3ec);
                                  *(uint *)(local_640.ray + 0x3f0) =
                                       (uint)bVar21 * iVar41 |
                                       (uint)!bVar21 * *(int *)(local_640.ray + 0x3f0);
                                  *(uint *)(local_640.ray + 0x3f4) =
                                       (uint)bVar22 * iVar42 |
                                       (uint)!bVar22 * *(int *)(local_640.ray + 0x3f4);
                                  *(uint *)(local_640.ray + 0x3f8) =
                                       (uint)bVar23 * iVar43 |
                                       (uint)!bVar23 * *(int *)(local_640.ray + 0x3f8);
                                  *(uint *)(local_640.ray + 0x3fc) =
                                       (uint)bVar24 * iVar44 |
                                       (uint)!bVar24 * *(int *)(local_640.ray + 0x3fc);
                                  iVar119 = *(int *)(local_640.hit + 0x104);
                                  iVar266 = *(int *)(local_640.hit + 0x108);
                                  iVar32 = *(int *)(local_640.hit + 0x10c);
                                  iVar33 = *(int *)(local_640.hit + 0x110);
                                  iVar34 = *(int *)(local_640.hit + 0x114);
                                  iVar35 = *(int *)(local_640.hit + 0x118);
                                  iVar36 = *(int *)(local_640.hit + 0x11c);
                                  iVar37 = *(int *)(local_640.hit + 0x120);
                                  iVar38 = *(int *)(local_640.hit + 0x124);
                                  iVar39 = *(int *)(local_640.hit + 0x128);
                                  iVar40 = *(int *)(local_640.hit + 300);
                                  iVar41 = *(int *)(local_640.hit + 0x130);
                                  iVar42 = *(int *)(local_640.hit + 0x134);
                                  iVar43 = *(int *)(local_640.hit + 0x138);
                                  iVar44 = *(int *)(local_640.hit + 0x13c);
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar51 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar51 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar51 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar51 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar51 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar51 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar51 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar51 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar51 >> 0xf,0);
                                  *(uint *)(local_640.ray + 0x400) =
                                       (uint)(bVar45 & 1) * *(int *)(local_640.hit + 0x100) |
                                       (uint)!(bool)(bVar45 & 1) * *(int *)(local_640.ray + 0x400);
                                  *(uint *)(local_640.ray + 0x404) =
                                       (uint)bVar25 * iVar119 |
                                       (uint)!bVar25 * *(int *)(local_640.ray + 0x404);
                                  *(uint *)(local_640.ray + 0x408) =
                                       (uint)bVar11 * iVar266 |
                                       (uint)!bVar11 * *(int *)(local_640.ray + 0x408);
                                  *(uint *)(local_640.ray + 0x40c) =
                                       (uint)bVar12 * iVar32 |
                                       (uint)!bVar12 * *(int *)(local_640.ray + 0x40c);
                                  *(uint *)(local_640.ray + 0x410) =
                                       (uint)bVar13 * iVar33 |
                                       (uint)!bVar13 * *(int *)(local_640.ray + 0x410);
                                  *(uint *)(local_640.ray + 0x414) =
                                       (uint)bVar14 * iVar34 |
                                       (uint)!bVar14 * *(int *)(local_640.ray + 0x414);
                                  *(uint *)(local_640.ray + 0x418) =
                                       (uint)bVar15 * iVar35 |
                                       (uint)!bVar15 * *(int *)(local_640.ray + 0x418);
                                  *(uint *)(local_640.ray + 0x41c) =
                                       (uint)bVar16 * iVar36 |
                                       (uint)!bVar16 * *(int *)(local_640.ray + 0x41c);
                                  *(uint *)(local_640.ray + 0x420) =
                                       (uint)(bVar17 & 1) * iVar37 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_640.ray + 0x420);
                                  *(uint *)(local_640.ray + 0x424) =
                                       (uint)bVar18 * iVar38 |
                                       (uint)!bVar18 * *(int *)(local_640.ray + 0x424);
                                  *(uint *)(local_640.ray + 0x428) =
                                       (uint)bVar19 * iVar39 |
                                       (uint)!bVar19 * *(int *)(local_640.ray + 0x428);
                                  *(uint *)(local_640.ray + 0x42c) =
                                       (uint)bVar20 * iVar40 |
                                       (uint)!bVar20 * *(int *)(local_640.ray + 0x42c);
                                  *(uint *)(local_640.ray + 0x430) =
                                       (uint)bVar21 * iVar41 |
                                       (uint)!bVar21 * *(int *)(local_640.ray + 0x430);
                                  *(uint *)(local_640.ray + 0x434) =
                                       (uint)bVar22 * iVar42 |
                                       (uint)!bVar22 * *(int *)(local_640.ray + 0x434);
                                  *(uint *)(local_640.ray + 0x438) =
                                       (uint)bVar23 * iVar43 |
                                       (uint)!bVar23 * *(int *)(local_640.ray + 0x438);
                                  *(uint *)(local_640.ray + 0x43c) =
                                       (uint)bVar24 * iVar44 |
                                       (uint)!bVar24 * *(int *)(local_640.ray + 0x43c);
                                  auVar104 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_640.hit + 0x140));
                                  auVar104 = vmovdqu32_avx512f(auVar104);
                                  *(undefined1 (*) [64])(local_640.ray + 0x440) = auVar104;
                                  auVar104 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_640.hit + 0x180));
                                  auVar104 = vmovdqu32_avx512f(auVar104);
                                  *(undefined1 (*) [64])(local_640.ray + 0x480) = auVar104;
                                  auVar265 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_640.hit + 0x1c0));
                                  auVar104 = vmovdqa32_avx512f(auVar265);
                                  *(undefined1 (*) [64])(local_640.ray + 0x4c0) = auVar104;
                                  auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_640.hit + 0x200));
                                  bVar25 = (bool)((byte)(uVar51 >> 1) & 1);
                                  auVar31._4_56_ = auVar123._8_56_;
                                  auVar31._0_4_ =
                                       (uint)bVar25 * auVar123._4_4_ |
                                       (uint)!bVar25 * auVar265._4_4_;
                                  auVar118._0_8_ = auVar31._0_8_ << 0x20;
                                  bVar25 = (bool)((byte)(uVar51 >> 2) & 1);
                                  auVar118._8_4_ =
                                       (uint)bVar25 * auVar123._8_4_ |
                                       (uint)!bVar25 * auVar265._8_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 3) & 1);
                                  auVar118._12_4_ =
                                       (uint)bVar25 * auVar123._12_4_ |
                                       (uint)!bVar25 * auVar265._12_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 4) & 1);
                                  auVar118._16_4_ =
                                       (uint)bVar25 * auVar123._16_4_ |
                                       (uint)!bVar25 * auVar265._16_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 5) & 1);
                                  auVar118._20_4_ =
                                       (uint)bVar25 * auVar123._20_4_ |
                                       (uint)!bVar25 * auVar265._20_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 6) & 1);
                                  auVar118._24_4_ =
                                       (uint)bVar25 * auVar123._24_4_ |
                                       (uint)!bVar25 * auVar265._24_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 7) & 1);
                                  auVar118._28_4_ =
                                       (uint)bVar25 * auVar123._28_4_ |
                                       (uint)!bVar25 * auVar265._28_4_;
                                  auVar118._32_4_ =
                                       (uint)(bVar17 & 1) * auVar123._32_4_ |
                                       (uint)!(bool)(bVar17 & 1) * auVar265._32_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 9) & 1);
                                  auVar118._36_4_ =
                                       (uint)bVar25 * auVar123._36_4_ |
                                       (uint)!bVar25 * auVar265._36_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 10) & 1);
                                  auVar118._40_4_ =
                                       (uint)bVar25 * auVar123._40_4_ |
                                       (uint)!bVar25 * auVar265._40_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                  auVar118._44_4_ =
                                       (uint)bVar25 * auVar123._44_4_ |
                                       (uint)!bVar25 * auVar265._44_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                  auVar118._48_4_ =
                                       (uint)bVar25 * auVar123._48_4_ |
                                       (uint)!bVar25 * auVar265._48_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                  auVar118._52_4_ =
                                       (uint)bVar25 * auVar123._52_4_ |
                                       (uint)!bVar25 * auVar265._52_4_;
                                  bVar25 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                  auVar118._56_4_ =
                                       (uint)bVar25 * auVar123._56_4_ |
                                       (uint)!bVar25 * auVar265._56_4_;
                                  bVar25 = SUB81(uVar51 >> 0xf,0);
                                  auVar118._60_4_ =
                                       (uint)bVar25 * auVar123._60_4_ |
                                       (uint)!bVar25 * auVar265._60_4_;
                                  auVar104._16_48_ = auVar118._16_48_;
                                  auVar265 = vmovdqa32_avx512f(auVar123);
                                  *(undefined1 (*) [64])(local_640.ray + 0x500) = auVar265;
                                }
                                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar265 = ZEXT1664(auVar60);
                                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar123 = ZEXT1664(auVar60);
                              }
                              auVar252 = ZEXT1664(auVar68);
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01b44add;
                  }
                  break;
                }
                lVar52 = lVar52 + -1;
              } while (lVar52 != 0);
            }
            auVar252 = ZEXT1664(auVar68);
          }
          else {
            auVar60 = vxorps_avx512vl(ZEXT416(5),auVar69);
            auVar267 = ZEXT1664(auVar60);
          }
        }
        else {
          auVar252 = ZEXT1664(auVar249);
        }
      }
LAB_01b44add:
      auVar106._32_32_ = auVar104._32_32_;
    } while (bVar10);
    auVar56 = vinsertps_avx512f(auVar59,auVar56,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }